

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx::CurveNiMBIntersectorK<4,4>::
     intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  Primitive PVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [12];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  LinearSpace3fa *pLVar60;
  uint uVar61;
  uint uVar62;
  ulong uVar63;
  long lVar64;
  ulong uVar65;
  byte bVar66;
  uint uVar67;
  long lVar68;
  uint uVar69;
  float fVar70;
  float fVar109;
  float fVar111;
  vint4 bi_1;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar110;
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar86 [16];
  float fVar112;
  float fVar113;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  float fVar114;
  undefined8 extraout_XMM1_Qa;
  vint4 bi;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar126 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 extraout_var [56];
  vint4 bi_2;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  float fVar179;
  float fVar180;
  float fVar193;
  float fVar195;
  vint4 ai_1;
  undefined1 auVar181 [16];
  float fVar197;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar194;
  float fVar196;
  float fVar198;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar199;
  undefined1 auVar192 [32];
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar223;
  float fVar225;
  vint4 ai_2;
  undefined1 auVar203 [16];
  float fVar228;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar224;
  float fVar226;
  float fVar227;
  float fVar229;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  float fVar230;
  float fVar242;
  float fVar243;
  undefined1 auVar231 [16];
  float fVar244;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar245;
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar258 [16];
  vint4 ai;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [32];
  float fVar270;
  float fVar286;
  float fVar287;
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  float fVar288;
  float fVar289;
  undefined1 auVar285 [32];
  float fVar290;
  float fVar299;
  float fVar300;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  float fVar302;
  float fVar303;
  float fVar304;
  undefined1 auVar297 [32];
  float fVar301;
  undefined1 auVar298 [32];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [32];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [32];
  float fVar324;
  float fVar332;
  float fVar333;
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  float fVar334;
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  float fVar343;
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar350 [64];
  float fVar355;
  vfloat4 a0;
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  undefined1 local_5c8 [8];
  float fStack_5c0;
  float fStack_5bc;
  undefined1 local_5b8 [8];
  float fStack_5b0;
  float fStack_5ac;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  undefined1 local_538 [8];
  float fStack_530;
  float fStack_52c;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float fStack_500;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  float fStack_4c0;
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 local_448 [16];
  undefined1 (*local_430) [16];
  LinearSpace3fa *local_428;
  Primitive *local_420;
  RTCFilterFunctionNArguments local_418;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  uint auStack_388 [4];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [32];
  float afStack_228 [8];
  RTCHitN local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  uint local_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint uStack_180;
  uint uStack_17c;
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  undefined1 auVar257 [32];
  undefined1 auVar349 [32];
  
  PVar6 = prim[1];
  uVar63 = (ulong)(byte)PVar6;
  lVar64 = uVar63 * 0x25;
  fVar114 = *(float *)(prim + lVar64 + 0x12);
  auVar90 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar310 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar310 = vinsertps_avx(auVar310,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar90 = vsubps_avx(auVar90,*(undefined1 (*) [16])(prim + lVar64 + 6));
  auVar115._0_4_ = fVar114 * auVar90._0_4_;
  auVar115._4_4_ = fVar114 * auVar90._4_4_;
  auVar115._8_4_ = fVar114 * auVar90._8_4_;
  auVar115._12_4_ = fVar114 * auVar90._12_4_;
  auVar259._0_4_ = fVar114 * auVar310._0_4_;
  auVar259._4_4_ = fVar114 * auVar310._4_4_;
  auVar259._8_4_ = fVar114 * auVar310._8_4_;
  auVar259._12_4_ = fVar114 * auVar310._12_4_;
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 4 + 6)));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar310 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 5 + 6)));
  auVar310 = vcvtdq2ps_avx(auVar310);
  auVar176 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 6 + 6)));
  auVar176 = vcvtdq2ps_avx(auVar176);
  auVar280 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0xf + 6)));
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar280 = vcvtdq2ps_avx(auVar280);
  auVar156 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar63 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar156 = vcvtdq2ps_avx(auVar156);
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1a + 6)));
  auVar209 = vcvtdq2ps_avx(auVar209);
  auVar140 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1b + 6)));
  auVar140 = vcvtdq2ps_avx(auVar140);
  auVar128 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1c + 6)));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar162 = vshufps_avx(auVar259,auVar259,0);
  auVar129 = vshufps_avx(auVar259,auVar259,0x55);
  auVar258 = vshufps_avx(auVar259,auVar259,0xaa);
  fVar114 = auVar258._0_4_;
  fVar70 = auVar258._4_4_;
  fVar109 = auVar258._8_4_;
  fVar111 = auVar258._12_4_;
  fVar200 = auVar129._0_4_;
  fVar223 = auVar129._4_4_;
  fVar225 = auVar129._8_4_;
  fVar228 = auVar129._12_4_;
  fVar179 = auVar162._0_4_;
  fVar193 = auVar162._4_4_;
  fVar195 = auVar162._8_4_;
  fVar197 = auVar162._12_4_;
  auVar325._0_4_ = fVar179 * auVar90._0_4_ + fVar200 * auVar310._0_4_ + fVar114 * auVar176._0_4_;
  auVar325._4_4_ = fVar193 * auVar90._4_4_ + fVar223 * auVar310._4_4_ + fVar70 * auVar176._4_4_;
  auVar325._8_4_ = fVar195 * auVar90._8_4_ + fVar225 * auVar310._8_4_ + fVar109 * auVar176._8_4_;
  auVar325._12_4_ = fVar197 * auVar90._12_4_ + fVar228 * auVar310._12_4_ + fVar111 * auVar176._12_4_
  ;
  auVar339._0_4_ = fVar179 * auVar280._0_4_ + fVar200 * auVar14._0_4_ + auVar156._0_4_ * fVar114;
  auVar339._4_4_ = fVar193 * auVar280._4_4_ + fVar223 * auVar14._4_4_ + auVar156._4_4_ * fVar70;
  auVar339._8_4_ = fVar195 * auVar280._8_4_ + fVar225 * auVar14._8_4_ + auVar156._8_4_ * fVar109;
  auVar339._12_4_ = fVar197 * auVar280._12_4_ + fVar228 * auVar14._12_4_ + auVar156._12_4_ * fVar111
  ;
  auVar260._0_4_ = fVar179 * auVar209._0_4_ + fVar200 * auVar140._0_4_ + auVar128._0_4_ * fVar114;
  auVar260._4_4_ = fVar193 * auVar209._4_4_ + fVar223 * auVar140._4_4_ + auVar128._4_4_ * fVar70;
  auVar260._8_4_ = fVar195 * auVar209._8_4_ + fVar225 * auVar140._8_4_ + auVar128._8_4_ * fVar109;
  auVar260._12_4_ =
       fVar197 * auVar209._12_4_ + fVar228 * auVar140._12_4_ + auVar128._12_4_ * fVar111;
  auVar162 = vshufps_avx(auVar115,auVar115,0);
  auVar129 = vshufps_avx(auVar115,auVar115,0x55);
  auVar258 = vshufps_avx(auVar115,auVar115,0xaa);
  fVar114 = auVar258._0_4_;
  fVar70 = auVar258._4_4_;
  fVar109 = auVar258._8_4_;
  fVar111 = auVar258._12_4_;
  fVar200 = auVar129._0_4_;
  fVar223 = auVar129._4_4_;
  fVar225 = auVar129._8_4_;
  fVar228 = auVar129._12_4_;
  fVar179 = auVar162._0_4_;
  fVar193 = auVar162._4_4_;
  fVar195 = auVar162._8_4_;
  fVar197 = auVar162._12_4_;
  auVar116._0_4_ = fVar179 * auVar90._0_4_ + fVar200 * auVar310._0_4_ + fVar114 * auVar176._0_4_;
  auVar116._4_4_ = fVar193 * auVar90._4_4_ + fVar223 * auVar310._4_4_ + fVar70 * auVar176._4_4_;
  auVar116._8_4_ = fVar195 * auVar90._8_4_ + fVar225 * auVar310._8_4_ + fVar109 * auVar176._8_4_;
  auVar116._12_4_ = fVar197 * auVar90._12_4_ + fVar228 * auVar310._12_4_ + fVar111 * auVar176._12_4_
  ;
  auVar71._0_4_ = fVar179 * auVar280._0_4_ + auVar156._0_4_ * fVar114 + fVar200 * auVar14._0_4_;
  auVar71._4_4_ = fVar193 * auVar280._4_4_ + auVar156._4_4_ * fVar70 + fVar223 * auVar14._4_4_;
  auVar71._8_4_ = fVar195 * auVar280._8_4_ + auVar156._8_4_ * fVar109 + fVar225 * auVar14._8_4_;
  auVar71._12_4_ = fVar197 * auVar280._12_4_ + auVar156._12_4_ * fVar111 + fVar228 * auVar14._12_4_;
  auVar271._8_4_ = 0x7fffffff;
  auVar271._0_8_ = 0x7fffffff7fffffff;
  auVar271._12_4_ = 0x7fffffff;
  auVar90 = vandps_avx(auVar325,auVar271);
  auVar203._8_4_ = 0x219392ef;
  auVar203._0_8_ = 0x219392ef219392ef;
  auVar203._12_4_ = 0x219392ef;
  auVar90 = vcmpps_avx(auVar90,auVar203,1);
  auVar310 = vblendvps_avx(auVar325,auVar203,auVar90);
  auVar90 = vandps_avx(auVar339,auVar271);
  auVar90 = vcmpps_avx(auVar90,auVar203,1);
  auVar176 = vblendvps_avx(auVar339,auVar203,auVar90);
  auVar90 = vandps_avx(auVar271,auVar260);
  auVar90 = vcmpps_avx(auVar90,auVar203,1);
  auVar90 = vblendvps_avx(auVar260,auVar203,auVar90);
  auVar148._0_4_ = fVar179 * auVar209._0_4_ + fVar200 * auVar140._0_4_ + auVar128._0_4_ * fVar114;
  auVar148._4_4_ = fVar193 * auVar209._4_4_ + fVar223 * auVar140._4_4_ + auVar128._4_4_ * fVar70;
  auVar148._8_4_ = fVar195 * auVar209._8_4_ + fVar225 * auVar140._8_4_ + auVar128._8_4_ * fVar109;
  auVar148._12_4_ =
       fVar197 * auVar209._12_4_ + fVar228 * auVar140._12_4_ + auVar128._12_4_ * fVar111;
  auVar280 = vrcpps_avx(auVar310);
  fVar179 = auVar280._0_4_;
  auVar181._0_4_ = fVar179 * auVar310._0_4_;
  fVar193 = auVar280._4_4_;
  auVar181._4_4_ = fVar193 * auVar310._4_4_;
  fVar195 = auVar280._8_4_;
  auVar181._8_4_ = fVar195 * auVar310._8_4_;
  fVar197 = auVar280._12_4_;
  auVar181._12_4_ = fVar197 * auVar310._12_4_;
  auVar272._8_4_ = 0x3f800000;
  auVar272._0_8_ = 0x3f8000003f800000;
  auVar272._12_4_ = 0x3f800000;
  auVar310 = vsubps_avx(auVar272,auVar181);
  fVar179 = fVar179 + fVar179 * auVar310._0_4_;
  fVar193 = fVar193 + fVar193 * auVar310._4_4_;
  fVar195 = fVar195 + fVar195 * auVar310._8_4_;
  fVar197 = fVar197 + fVar197 * auVar310._12_4_;
  auVar310 = vrcpps_avx(auVar176);
  fVar200 = auVar310._0_4_;
  auVar231._0_4_ = fVar200 * auVar176._0_4_;
  fVar223 = auVar310._4_4_;
  auVar231._4_4_ = fVar223 * auVar176._4_4_;
  fVar225 = auVar310._8_4_;
  auVar231._8_4_ = fVar225 * auVar176._8_4_;
  fVar228 = auVar310._12_4_;
  auVar231._12_4_ = fVar228 * auVar176._12_4_;
  auVar310 = vsubps_avx(auVar272,auVar231);
  fVar200 = fVar200 + fVar200 * auVar310._0_4_;
  fVar223 = fVar223 + fVar223 * auVar310._4_4_;
  fVar225 = fVar225 + fVar225 * auVar310._8_4_;
  fVar228 = fVar228 + fVar228 * auVar310._12_4_;
  auVar310 = vrcpps_avx(auVar90);
  fVar230 = auVar310._0_4_;
  auVar246._0_4_ = fVar230 * auVar90._0_4_;
  fVar242 = auVar310._4_4_;
  auVar246._4_4_ = fVar242 * auVar90._4_4_;
  fVar243 = auVar310._8_4_;
  auVar246._8_4_ = fVar243 * auVar90._8_4_;
  fVar244 = auVar310._12_4_;
  auVar246._12_4_ = fVar244 * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar272,auVar246);
  fVar230 = fVar230 + fVar230 * auVar90._0_4_;
  fVar242 = fVar242 + fVar242 * auVar90._4_4_;
  fVar243 = fVar243 + fVar243 * auVar90._8_4_;
  fVar244 = fVar244 + fVar244 * auVar90._12_4_;
  auVar90 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar64 + 0x16)) *
                          *(float *)(prim + lVar64 + 0x1a)));
  auVar176 = vshufps_avx(auVar90,auVar90,0);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar63 * 7 + 6);
  auVar90 = vpmovsxwd_avx(auVar90);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar310._8_8_ = 0;
  auVar310._0_8_ = *(ulong *)(prim + uVar63 * 0xb + 6);
  auVar310 = vpmovsxwd_avx(auVar310);
  auVar310 = vcvtdq2ps_avx(auVar310);
  auVar280 = vsubps_avx(auVar310,auVar90);
  fVar114 = auVar176._0_4_;
  fVar70 = auVar176._4_4_;
  fVar109 = auVar176._8_4_;
  fVar111 = auVar176._12_4_;
  auVar176._8_8_ = 0;
  auVar176._0_8_ = *(ulong *)(prim + uVar63 * 9 + 6);
  auVar310 = vpmovsxwd_avx(auVar176);
  auVar261._0_4_ = auVar280._0_4_ * fVar114 + auVar90._0_4_;
  auVar261._4_4_ = auVar280._4_4_ * fVar70 + auVar90._4_4_;
  auVar261._8_4_ = auVar280._8_4_ * fVar109 + auVar90._8_4_;
  auVar261._12_4_ = auVar280._12_4_ * fVar111 + auVar90._12_4_;
  auVar280._8_8_ = 0;
  auVar280._0_8_ = *(ulong *)(prim + uVar63 * 0xd + 6);
  auVar176 = vpmovsxwd_avx(auVar280);
  auVar90 = vcvtdq2ps_avx(auVar310);
  auVar310 = vcvtdq2ps_avx(auVar176);
  auVar310 = vsubps_avx(auVar310,auVar90);
  auVar273._0_4_ = auVar310._0_4_ * fVar114 + auVar90._0_4_;
  auVar273._4_4_ = auVar310._4_4_ * fVar70 + auVar90._4_4_;
  auVar273._8_4_ = auVar310._8_4_ * fVar109 + auVar90._8_4_;
  auVar273._12_4_ = auVar310._12_4_ * fVar111 + auVar90._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar63 * 0x12 + 6);
  auVar90 = vpmovsxwd_avx(auVar14);
  uVar65 = (ulong)(uint)((int)(uVar63 * 5) << 2);
  auVar156._8_8_ = 0;
  auVar156._0_8_ = *(ulong *)(prim + uVar63 * 2 + uVar65 + 6);
  auVar310 = vpmovsxwd_avx(auVar156);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar310 = vcvtdq2ps_avx(auVar310);
  auVar310 = vsubps_avx(auVar310,auVar90);
  auVar291._0_4_ = auVar310._0_4_ * fVar114 + auVar90._0_4_;
  auVar291._4_4_ = auVar310._4_4_ * fVar70 + auVar90._4_4_;
  auVar291._8_4_ = auVar310._8_4_ * fVar109 + auVar90._8_4_;
  auVar291._12_4_ = auVar310._12_4_ * fVar111 + auVar90._12_4_;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = *(ulong *)(prim + uVar65 + 6);
  auVar90 = vpmovsxwd_avx(auVar209);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar140._8_8_ = 0;
  auVar140._0_8_ = *(ulong *)(prim + uVar63 * 0x18 + 6);
  auVar310 = vpmovsxwd_avx(auVar140);
  auVar310 = vcvtdq2ps_avx(auVar310);
  auVar176 = vsubps_avx(auVar310,auVar90);
  auVar128._8_8_ = 0;
  auVar128._0_8_ = *(ulong *)(prim + uVar63 * 0x1d + 6);
  auVar310 = vpmovsxwd_avx(auVar128);
  auVar305._0_4_ = auVar176._0_4_ * fVar114 + auVar90._0_4_;
  auVar305._4_4_ = auVar176._4_4_ * fVar70 + auVar90._4_4_;
  auVar305._8_4_ = auVar176._8_4_ * fVar109 + auVar90._8_4_;
  auVar305._12_4_ = auVar176._12_4_ * fVar111 + auVar90._12_4_;
  auVar90 = vcvtdq2ps_avx(auVar310);
  auVar162._8_8_ = 0;
  auVar162._0_8_ = *(ulong *)(prim + uVar63 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar310 = vpmovsxwd_avx(auVar162);
  auVar310 = vcvtdq2ps_avx(auVar310);
  auVar310 = vsubps_avx(auVar310,auVar90);
  auVar317._0_4_ = auVar310._0_4_ * fVar114 + auVar90._0_4_;
  auVar317._4_4_ = auVar310._4_4_ * fVar70 + auVar90._4_4_;
  auVar317._8_4_ = auVar310._8_4_ * fVar109 + auVar90._8_4_;
  auVar317._12_4_ = auVar310._12_4_ * fVar111 + auVar90._12_4_;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar63) + 6);
  auVar90 = vpmovsxwd_avx(auVar129);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar258._8_8_ = 0;
  auVar258._0_8_ = *(ulong *)(prim + uVar63 * 0x23 + 6);
  auVar310 = vpmovsxwd_avx(auVar258);
  auVar310 = vcvtdq2ps_avx(auVar310);
  auVar310 = vsubps_avx(auVar310,auVar90);
  auVar247._0_4_ = auVar90._0_4_ + auVar310._0_4_ * fVar114;
  auVar247._4_4_ = auVar90._4_4_ + auVar310._4_4_ * fVar70;
  auVar247._8_4_ = auVar90._8_4_ + auVar310._8_4_ * fVar109;
  auVar247._12_4_ = auVar90._12_4_ + auVar310._12_4_ * fVar111;
  auVar90 = vsubps_avx(auVar261,auVar116);
  auVar262._0_4_ = fVar179 * auVar90._0_4_;
  auVar262._4_4_ = fVar193 * auVar90._4_4_;
  auVar262._8_4_ = fVar195 * auVar90._8_4_;
  auVar262._12_4_ = fVar197 * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar273,auVar116);
  auVar117._0_4_ = fVar179 * auVar90._0_4_;
  auVar117._4_4_ = fVar193 * auVar90._4_4_;
  auVar117._8_4_ = fVar195 * auVar90._8_4_;
  auVar117._12_4_ = fVar197 * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar291,auVar71);
  auVar182._0_4_ = fVar200 * auVar90._0_4_;
  auVar182._4_4_ = fVar223 * auVar90._4_4_;
  auVar182._8_4_ = fVar225 * auVar90._8_4_;
  auVar182._12_4_ = fVar228 * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar305,auVar71);
  auVar72._0_4_ = fVar200 * auVar90._0_4_;
  auVar72._4_4_ = fVar223 * auVar90._4_4_;
  auVar72._8_4_ = fVar225 * auVar90._8_4_;
  auVar72._12_4_ = fVar228 * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar317,auVar148);
  auVar204._0_4_ = fVar230 * auVar90._0_4_;
  auVar204._4_4_ = fVar242 * auVar90._4_4_;
  auVar204._8_4_ = fVar243 * auVar90._8_4_;
  auVar204._12_4_ = fVar244 * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar247,auVar148);
  auVar149._0_4_ = fVar230 * auVar90._0_4_;
  auVar149._4_4_ = fVar242 * auVar90._4_4_;
  auVar149._8_4_ = fVar243 * auVar90._8_4_;
  auVar149._12_4_ = fVar244 * auVar90._12_4_;
  auVar90 = vpminsd_avx(auVar262,auVar117);
  auVar310 = vpminsd_avx(auVar182,auVar72);
  auVar90 = vmaxps_avx(auVar90,auVar310);
  auVar310 = vpminsd_avx(auVar204,auVar149);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar274._4_4_ = uVar4;
  auVar274._0_4_ = uVar4;
  auVar274._8_4_ = uVar4;
  auVar274._12_4_ = uVar4;
  auVar310 = vmaxps_avx(auVar310,auVar274);
  auVar90 = vmaxps_avx(auVar90,auVar310);
  local_358._0_4_ = auVar90._0_4_ * 0.99999964;
  local_358._4_4_ = auVar90._4_4_ * 0.99999964;
  local_358._8_4_ = auVar90._8_4_ * 0.99999964;
  local_358._12_4_ = auVar90._12_4_ * 0.99999964;
  auVar90 = vpmaxsd_avx(auVar262,auVar117);
  auVar310 = vpmaxsd_avx(auVar182,auVar72);
  auVar90 = vminps_avx(auVar90,auVar310);
  auVar310 = vpmaxsd_avx(auVar204,auVar149);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar150._4_4_ = uVar4;
  auVar150._0_4_ = uVar4;
  auVar150._8_4_ = uVar4;
  auVar150._12_4_ = uVar4;
  auVar310 = vminps_avx(auVar310,auVar150);
  auVar90 = vminps_avx(auVar90,auVar310);
  auVar73._0_4_ = auVar90._0_4_ * 1.0000004;
  auVar73._4_4_ = auVar90._4_4_ * 1.0000004;
  auVar73._8_4_ = auVar90._8_4_ * 1.0000004;
  auVar73._12_4_ = auVar90._12_4_ * 1.0000004;
  auVar90 = vpshufd_avx(ZEXT116((byte)PVar6),0);
  auVar310 = vpcmpgtd_avx(auVar90,_DAT_01f7fcf0);
  auVar90 = vcmpps_avx(local_358,auVar73,2);
  auVar90 = vandps_avx(auVar90,auVar310);
  uVar61 = vmovmskps_avx(auVar90);
  if (uVar61 == 0) {
    return;
  }
  uVar61 = uVar61 & 0xff;
  local_428 = pre->ray_space + k;
  auVar103._16_16_ = mm_lookupmask_ps._240_16_;
  auVar103._0_16_ = mm_lookupmask_ps._240_16_;
  local_178 = vblendps_avx(auVar103,ZEXT832(0) << 0x20,0x80);
  local_430 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar52 = ZEXT412(0);
  local_420 = prim;
  do {
    pLVar60 = local_428;
    auVar54._12_4_ = 0;
    auVar54._0_12_ = auVar52;
    lVar64 = 0;
    if (uVar61 != 0) {
      for (; (uVar61 >> lVar64 & 1) == 0; lVar64 = lVar64 + 1) {
      }
    }
    uVar62 = *(uint *)(local_420 + 2);
    uVar7 = *(uint *)(local_420 + lVar64 * 4 + 6);
    pGVar8 = (context->scene->geometries).items[uVar62].ptr;
    fVar114 = (pGVar8->time_range).lower;
    fVar114 = pGVar8->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x70) - fVar114) / ((pGVar8->time_range).upper - fVar114));
    auVar90 = vroundss_avx(ZEXT416((uint)fVar114),ZEXT416((uint)fVar114),9);
    auVar90 = vminss_avx(auVar90,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
    auVar90 = vmaxss_avx(auVar54 << 0x20,auVar90);
    uVar63 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                             (ulong)uVar7 *
                             pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i);
    _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar68 = (long)(int)auVar90._0_4_ * 0x38;
    lVar10 = *(long *)(_Var9 + lVar68);
    lVar11 = *(long *)(_Var9 + 0x10 + lVar68);
    pfVar3 = (float *)(lVar10 + lVar11 * uVar63);
    fVar70 = *pfVar3;
    fVar109 = pfVar3[1];
    fVar111 = pfVar3[2];
    fVar179 = pfVar3[3];
    lVar64 = uVar63 + 1;
    pfVar3 = (float *)(lVar10 + lVar11 * lVar64);
    fVar193 = *pfVar3;
    fVar195 = pfVar3[1];
    fVar197 = pfVar3[2];
    fVar200 = pfVar3[3];
    lVar1 = uVar63 + 2;
    pfVar3 = (float *)(lVar10 + lVar11 * lVar1);
    fVar223 = *pfVar3;
    fVar225 = pfVar3[1];
    fVar228 = pfVar3[2];
    fVar230 = pfVar3[3];
    lVar2 = uVar63 + 3;
    pfVar3 = (float *)(lVar10 + lVar11 * lVar2);
    fVar242 = *pfVar3;
    fVar243 = pfVar3[1];
    fVar244 = pfVar3[2];
    fVar110 = pfVar3[3];
    lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
    lVar11 = *(long *)(lVar10 + lVar68);
    lVar12 = *(long *)(lVar10 + 0x10 + lVar68);
    pfVar3 = (float *)(lVar11 + lVar12 * uVar63);
    fVar180 = *pfVar3;
    fVar194 = pfVar3[1];
    fVar196 = pfVar3[2];
    fVar198 = pfVar3[3];
    pfVar3 = (float *)(lVar11 + lVar12 * lVar64);
    fVar201 = *pfVar3;
    fVar224 = pfVar3[1];
    fVar226 = pfVar3[2];
    fVar229 = pfVar3[3];
    pfVar3 = (float *)(lVar11 + lVar12 * lVar1);
    fVar112 = *pfVar3;
    fVar113 = pfVar3[1];
    fVar199 = pfVar3[2];
    fVar245 = pfVar3[3];
    fVar114 = fVar114 - auVar90._0_4_;
    pfVar3 = (float *)(lVar11 + lVar12 * lVar2);
    fVar202 = *pfVar3;
    fVar270 = pfVar3[1];
    fVar227 = pfVar3[2];
    fVar286 = pfVar3[3];
    auVar74._0_4_ = fVar193 * 0.0 + fVar223 * 0.5 + fVar242 * 0.0;
    auVar74._4_4_ = fVar195 * 0.0 + fVar225 * 0.5 + fVar243 * 0.0;
    auVar74._8_4_ = fVar197 * 0.0 + fVar228 * 0.5 + fVar244 * 0.0;
    auVar74._12_4_ = fVar200 * 0.0 + fVar230 * 0.5 + fVar110 * 0.0;
    auVar151._0_4_ = fVar70 * 0.5;
    auVar151._4_4_ = fVar109 * 0.5;
    auVar151._8_4_ = fVar111 * 0.5;
    auVar151._12_4_ = fVar179 * 0.5;
    auVar140 = vsubps_avx(auVar74,auVar151);
    auVar75._0_4_ = fVar201 * 0.0 + fVar112 * 0.5 + fVar202 * 0.0;
    auVar75._4_4_ = fVar224 * 0.0 + fVar113 * 0.5 + fVar270 * 0.0;
    auVar75._8_4_ = fVar226 * 0.0 + fVar199 * 0.5 + fVar227 * 0.0;
    auVar75._12_4_ = fVar229 * 0.0 + fVar245 * 0.5 + fVar286 * 0.0;
    auVar344._0_4_ = fVar180 * 0.5;
    auVar344._4_4_ = fVar194 * 0.5;
    auVar344._8_4_ = fVar196 * 0.5;
    auVar344._12_4_ = fVar198 * 0.5;
    auVar280 = vsubps_avx(auVar75,auVar344);
    local_5c8._0_4_ = fVar70 * -0.0 + fVar223 * 0.0 + fVar242 * -0.0 + fVar193;
    local_5c8._4_4_ = fVar109 * -0.0 + fVar225 * 0.0 + fVar243 * -0.0 + fVar195;
    fStack_5c0 = fVar111 * -0.0 + fVar228 * 0.0 + fVar244 * -0.0 + fVar197;
    fStack_5bc = fVar179 * -0.0 + fVar230 * 0.0 + fVar110 * -0.0 + fVar200;
    local_538._0_4_ = fVar70 * -0.0 + fVar193 * 0.0 + fVar223 + fVar242 * -0.0;
    local_538._4_4_ = fVar109 * -0.0 + fVar195 * 0.0 + fVar225 + fVar243 * -0.0;
    fStack_530 = fVar111 * -0.0 + fVar197 * 0.0 + fVar228 + fVar244 * -0.0;
    fStack_52c = fVar179 * -0.0 + fVar200 * 0.0 + fVar230 + fVar110 * -0.0;
    auVar275._0_4_ = fVar223 * 0.0 + fVar242 * 0.5;
    auVar275._4_4_ = fVar225 * 0.0 + fVar243 * 0.5;
    auVar275._8_4_ = fVar228 * 0.0 + fVar244 * 0.5;
    auVar275._12_4_ = fVar230 * 0.0 + fVar110 * 0.5;
    auVar205._0_4_ = fVar193 * 0.5;
    auVar205._4_4_ = fVar195 * 0.5;
    auVar205._8_4_ = fVar197 * 0.5;
    auVar205._12_4_ = fVar200 * 0.5;
    auVar90 = vsubps_avx(auVar275,auVar205);
    auVar351._0_4_ = fVar180 * -0.0 + fVar112 * 0.0 + fVar202 * -0.0 + fVar201;
    auVar351._4_4_ = fVar194 * -0.0 + fVar113 * 0.0 + fVar270 * -0.0 + fVar224;
    auVar351._8_4_ = fVar196 * -0.0 + fVar199 * 0.0 + fVar227 * -0.0 + fVar226;
    auVar351._12_4_ = fVar198 * -0.0 + fVar245 * 0.0 + fVar286 * -0.0 + fVar229;
    auVar292._0_4_ = fVar70 * 0.0 + auVar90._0_4_;
    auVar292._4_4_ = fVar109 * 0.0 + auVar90._4_4_;
    auVar292._8_4_ = fVar111 * 0.0 + auVar90._8_4_;
    auVar292._12_4_ = fVar179 * 0.0 + auVar90._12_4_;
    auVar183._0_4_ = fVar180 * -0.0 + fVar201 * 0.0 + fVar112 + fVar202 * -0.0;
    auVar183._4_4_ = fVar194 * -0.0 + fVar224 * 0.0 + fVar113 + fVar270 * -0.0;
    auVar183._8_4_ = fVar196 * -0.0 + fVar226 * 0.0 + fVar199 + fVar227 * -0.0;
    auVar183._12_4_ = fVar198 * -0.0 + fVar229 * 0.0 + fVar245 + fVar286 * -0.0;
    auVar206._0_4_ = fVar112 * 0.0 + fVar202 * 0.5;
    auVar206._4_4_ = fVar113 * 0.0 + fVar270 * 0.5;
    auVar206._8_4_ = fVar199 * 0.0 + fVar227 * 0.5;
    auVar206._12_4_ = fVar245 * 0.0 + fVar286 * 0.5;
    auVar263._0_4_ = fVar201 * 0.5;
    auVar263._4_4_ = fVar224 * 0.5;
    auVar263._8_4_ = fVar226 * 0.5;
    auVar263._12_4_ = fVar229 * 0.5;
    auVar90 = vsubps_avx(auVar206,auVar263);
    auVar207._0_4_ = fVar180 * 0.0 + auVar90._0_4_;
    auVar207._4_4_ = fVar194 * 0.0 + auVar90._4_4_;
    auVar207._8_4_ = fVar196 * 0.0 + auVar90._8_4_;
    auVar207._12_4_ = fVar198 * 0.0 + auVar90._12_4_;
    auVar90 = vshufps_avx(auVar140,auVar140,0xc9);
    auVar310 = vshufps_avx(auVar351,auVar351,0xc9);
    fVar324 = auVar140._0_4_;
    auVar232._0_4_ = fVar324 * auVar310._0_4_;
    fVar287 = auVar140._4_4_;
    auVar232._4_4_ = fVar287 * auVar310._4_4_;
    fVar332 = auVar140._8_4_;
    auVar232._8_4_ = fVar332 * auVar310._8_4_;
    fVar288 = auVar140._12_4_;
    auVar232._12_4_ = fVar288 * auVar310._12_4_;
    auVar276._0_4_ = auVar351._0_4_ * auVar90._0_4_;
    auVar276._4_4_ = auVar351._4_4_ * auVar90._4_4_;
    auVar276._8_4_ = auVar351._8_4_ * auVar90._8_4_;
    auVar276._12_4_ = auVar351._12_4_ * auVar90._12_4_;
    auVar310 = vsubps_avx(auVar276,auVar232);
    auVar176 = vshufps_avx(auVar310,auVar310,0xc9);
    auVar310 = vshufps_avx(auVar280,auVar280,0xc9);
    auVar277._0_4_ = auVar310._0_4_ * fVar324;
    auVar277._4_4_ = auVar310._4_4_ * fVar287;
    auVar277._8_4_ = auVar310._8_4_ * fVar332;
    auVar277._12_4_ = auVar310._12_4_ * fVar288;
    auVar76._0_4_ = auVar90._0_4_ * auVar280._0_4_;
    auVar76._4_4_ = auVar90._4_4_ * auVar280._4_4_;
    auVar76._8_4_ = auVar90._8_4_ * auVar280._8_4_;
    auVar76._12_4_ = auVar90._12_4_ * auVar280._12_4_;
    auVar90 = vsubps_avx(auVar76,auVar277);
    auVar280 = vshufps_avx(auVar90,auVar90,0xc9);
    auVar90 = vshufps_avx(auVar292,auVar292,0xc9);
    auVar310 = vshufps_avx(auVar183,auVar183,0xc9);
    auVar278._0_4_ = auVar292._0_4_ * auVar310._0_4_;
    auVar278._4_4_ = auVar292._4_4_ * auVar310._4_4_;
    auVar278._8_4_ = auVar292._8_4_ * auVar310._8_4_;
    auVar278._12_4_ = auVar292._12_4_ * auVar310._12_4_;
    auVar184._0_4_ = auVar90._0_4_ * auVar183._0_4_;
    auVar184._4_4_ = auVar90._4_4_ * auVar183._4_4_;
    auVar184._8_4_ = auVar90._8_4_ * auVar183._8_4_;
    auVar184._12_4_ = auVar90._12_4_ * auVar183._12_4_;
    auVar310 = vsubps_avx(auVar184,auVar278);
    auVar14 = vshufps_avx(auVar310,auVar310,0xc9);
    auVar310 = vshufps_avx(auVar207,auVar207,0xc9);
    auVar279._0_4_ = auVar292._0_4_ * auVar310._0_4_;
    auVar279._4_4_ = auVar292._4_4_ * auVar310._4_4_;
    auVar279._8_4_ = auVar292._8_4_ * auVar310._8_4_;
    auVar279._12_4_ = auVar292._12_4_ * auVar310._12_4_;
    auVar208._0_4_ = auVar90._0_4_ * auVar207._0_4_;
    auVar208._4_4_ = auVar90._4_4_ * auVar207._4_4_;
    auVar208._8_4_ = auVar90._8_4_ * auVar207._8_4_;
    auVar208._12_4_ = auVar90._12_4_ * auVar207._12_4_;
    auVar90 = vsubps_avx(auVar208,auVar279);
    auVar156 = vshufps_avx(auVar90,auVar90,0xc9);
    auVar90 = vdpps_avx(auVar176,auVar176,0x7f);
    fVar109 = auVar90._0_4_;
    auVar162 = ZEXT416((uint)fVar109);
    auVar310 = vrsqrtss_avx(auVar162,auVar162);
    fVar70 = auVar310._0_4_;
    auVar310 = vdpps_avx(auVar176,auVar280,0x7f);
    auVar209 = ZEXT416((uint)(fVar70 * 1.5 - fVar109 * 0.5 * fVar70 * fVar70 * fVar70));
    auVar209 = vshufps_avx(auVar209,auVar209,0);
    fVar201 = auVar209._0_4_ * auVar176._0_4_;
    fVar224 = auVar209._4_4_ * auVar176._4_4_;
    fVar226 = auVar209._8_4_ * auVar176._8_4_;
    fVar229 = auVar209._12_4_ * auVar176._12_4_;
    auVar90 = vshufps_avx(auVar90,auVar90,0);
    auVar77._0_4_ = auVar90._0_4_ * auVar280._0_4_;
    auVar77._4_4_ = auVar90._4_4_ * auVar280._4_4_;
    auVar77._8_4_ = auVar90._8_4_ * auVar280._8_4_;
    auVar77._12_4_ = auVar90._12_4_ * auVar280._12_4_;
    auVar90 = vshufps_avx(auVar310,auVar310,0);
    auVar233._0_4_ = auVar90._0_4_ * auVar176._0_4_;
    auVar233._4_4_ = auVar90._4_4_ * auVar176._4_4_;
    auVar233._8_4_ = auVar90._8_4_ * auVar176._8_4_;
    auVar233._12_4_ = auVar90._12_4_ * auVar176._12_4_;
    auVar128 = vsubps_avx(auVar77,auVar233);
    auVar90 = vrcpss_avx(auVar162,auVar162);
    auVar90 = ZEXT416((uint)(auVar90._0_4_ * (2.0 - fVar109 * auVar90._0_4_)));
    auVar176 = vshufps_avx(auVar90,auVar90,0);
    auVar90 = vdpps_avx(auVar14,auVar14,0x7f);
    fVar112 = auVar90._0_4_;
    auVar280 = ZEXT416((uint)fVar112);
    auVar310 = vrsqrtss_avx(auVar280,auVar280);
    fVar180 = auVar310._0_4_;
    auVar310 = vdpps_avx(auVar14,auVar156,0x7f);
    auVar90 = vshufps_avx(auVar90,auVar90,0);
    auVar352._0_4_ = auVar156._0_4_ * auVar90._0_4_;
    auVar352._4_4_ = auVar156._4_4_ * auVar90._4_4_;
    auVar352._8_4_ = auVar156._8_4_ * auVar90._8_4_;
    auVar352._12_4_ = auVar156._12_4_ * auVar90._12_4_;
    lVar11 = *(long *)(_Var9 + 0x38 + lVar68);
    lVar12 = *(long *)(_Var9 + 0x48 + lVar68);
    pfVar3 = (float *)(lVar11 + lVar12 * uVar63);
    fVar70 = *pfVar3;
    fVar109 = pfVar3[1];
    fVar111 = pfVar3[2];
    fVar179 = pfVar3[3];
    pfVar3 = (float *)(lVar11 + lVar12 * lVar64);
    fVar193 = *pfVar3;
    fVar195 = pfVar3[1];
    fVar197 = pfVar3[2];
    fVar200 = pfVar3[3];
    pfVar3 = (float *)(lVar11 + lVar12 * lVar1);
    fVar223 = *pfVar3;
    fVar225 = pfVar3[1];
    fVar228 = pfVar3[2];
    fVar230 = pfVar3[3];
    auVar90 = vshufps_avx(auVar310,auVar310,0);
    auVar78._0_4_ = auVar90._0_4_ * auVar14._0_4_;
    auVar78._4_4_ = auVar90._4_4_ * auVar14._4_4_;
    auVar78._8_4_ = auVar90._8_4_ * auVar14._8_4_;
    auVar78._12_4_ = auVar90._12_4_ * auVar14._12_4_;
    auVar156 = vsubps_avx(auVar352,auVar78);
    pfVar3 = (float *)(lVar11 + lVar12 * lVar2);
    fVar242 = *pfVar3;
    fVar243 = pfVar3[1];
    fVar244 = pfVar3[2];
    fVar110 = pfVar3[3];
    lVar11 = *(long *)(lVar10 + 0x38 + lVar68);
    lVar10 = *(long *)(lVar10 + 0x48 + lVar68);
    auVar90 = ZEXT416((uint)(fVar180 * 1.5 - fVar112 * 0.5 * fVar180 * fVar180 * fVar180));
    auVar310 = vshufps_avx(auVar90,auVar90,0);
    fVar180 = auVar310._0_4_ * auVar14._0_4_;
    fVar194 = auVar310._4_4_ * auVar14._4_4_;
    fVar196 = auVar310._8_4_ * auVar14._8_4_;
    fVar198 = auVar310._12_4_ * auVar14._12_4_;
    auVar90 = vrcpss_avx(auVar280,auVar280);
    auVar90 = ZEXT416((uint)(auVar90._0_4_ * (2.0 - auVar90._0_4_ * fVar112)));
    auVar90 = vshufps_avx(auVar90,auVar90,0);
    auVar280 = vshufps_avx(_local_5c8,_local_5c8,0xff);
    auVar326._0_4_ = auVar280._0_4_ * fVar201;
    auVar326._4_4_ = auVar280._4_4_ * fVar224;
    auVar326._8_4_ = auVar280._8_4_ * fVar226;
    auVar326._12_4_ = auVar280._12_4_ * fVar229;
    auVar14 = vshufps_avx(auVar140,auVar140,0xff);
    auVar162 = vsubps_avx(_local_5c8,auVar326);
    auVar264._0_4_ =
         auVar14._0_4_ * fVar201 + auVar280._0_4_ * auVar209._0_4_ * auVar128._0_4_ * auVar176._0_4_
    ;
    auVar264._4_4_ =
         auVar14._4_4_ * fVar224 + auVar280._4_4_ * auVar209._4_4_ * auVar128._4_4_ * auVar176._4_4_
    ;
    auVar264._8_4_ =
         auVar14._8_4_ * fVar226 + auVar280._8_4_ * auVar209._8_4_ * auVar128._8_4_ * auVar176._8_4_
    ;
    auVar264._12_4_ =
         auVar14._12_4_ * fVar229 +
         auVar280._12_4_ * auVar209._12_4_ * auVar128._12_4_ * auVar176._12_4_;
    auVar128 = vsubps_avx(auVar140,auVar264);
    local_5c8._0_4_ = auVar326._0_4_ + (float)local_5c8._0_4_;
    local_5c8._4_4_ = auVar326._4_4_ + (float)local_5c8._4_4_;
    fStack_5c0 = auVar326._8_4_ + fStack_5c0;
    fStack_5bc = auVar326._12_4_ + fStack_5bc;
    auVar176 = vshufps_avx(_local_538,_local_538,0xff);
    auVar152._0_4_ = auVar176._0_4_ * fVar180;
    auVar152._4_4_ = auVar176._4_4_ * fVar194;
    auVar152._8_4_ = auVar176._8_4_ * fVar196;
    auVar152._12_4_ = auVar176._12_4_ * fVar198;
    auVar280 = vshufps_avx(auVar292,auVar292,0xff);
    auVar129 = vsubps_avx(_local_538,auVar152);
    auVar79._0_4_ =
         auVar280._0_4_ * fVar180 + auVar176._0_4_ * auVar310._0_4_ * auVar156._0_4_ * auVar90._0_4_
    ;
    auVar79._4_4_ =
         auVar280._4_4_ * fVar194 + auVar176._4_4_ * auVar310._4_4_ * auVar156._4_4_ * auVar90._4_4_
    ;
    auVar79._8_4_ =
         auVar280._8_4_ * fVar196 + auVar176._8_4_ * auVar310._8_4_ * auVar156._8_4_ * auVar90._8_4_
    ;
    auVar79._12_4_ =
         auVar280._12_4_ * fVar198 +
         auVar176._12_4_ * auVar310._12_4_ * auVar156._12_4_ * auVar90._12_4_;
    auVar258 = vsubps_avx(auVar292,auVar79);
    local_538._0_4_ = (float)local_538._0_4_ + auVar152._0_4_;
    local_538._4_4_ = (float)local_538._4_4_ + auVar152._4_4_;
    fStack_530 = fStack_530 + auVar152._8_4_;
    fStack_52c = fStack_52c + auVar152._12_4_;
    auVar80._0_4_ = fVar193 * 0.0 + fVar223 * 0.5 + fVar242 * 0.0;
    auVar80._4_4_ = fVar195 * 0.0 + fVar225 * 0.5 + fVar243 * 0.0;
    auVar80._8_4_ = fVar197 * 0.0 + fVar228 * 0.5 + fVar244 * 0.0;
    auVar80._12_4_ = fVar200 * 0.0 + fVar230 * 0.5 + fVar110 * 0.0;
    auVar118._0_4_ = fVar70 * 0.5;
    auVar118._4_4_ = fVar109 * 0.5;
    auVar118._8_4_ = fVar111 * 0.5;
    auVar118._12_4_ = fVar179 * 0.5;
    auVar71 = vsubps_avx(auVar80,auVar118);
    pfVar3 = (float *)(lVar11 + lVar1 * lVar10);
    fVar180 = *pfVar3;
    fVar194 = pfVar3[1];
    fVar196 = pfVar3[2];
    fVar198 = pfVar3[3];
    auVar90 = *(undefined1 (*) [16])(lVar11 + lVar10 * lVar2);
    fVar202 = auVar90._0_4_;
    fVar270 = auVar90._4_4_;
    fVar227 = auVar90._8_4_;
    fVar286 = auVar90._12_4_;
    pfVar3 = (float *)(lVar11 + lVar64 * lVar10);
    fVar201 = *pfVar3;
    fVar224 = pfVar3[1];
    fVar226 = pfVar3[2];
    fVar229 = pfVar3[3];
    auVar248._0_4_ = fVar201 * 0.0 + fVar202 * 0.0 + fVar180 * 0.5;
    auVar248._4_4_ = fVar224 * 0.0 + fVar270 * 0.0 + fVar194 * 0.5;
    auVar248._8_4_ = fVar226 * 0.0 + fVar227 * 0.0 + fVar196 * 0.5;
    auVar248._12_4_ = fVar229 * 0.0 + fVar286 * 0.0 + fVar198 * 0.5;
    pfVar3 = (float *)(lVar11 + uVar63 * lVar10);
    fVar112 = *pfVar3;
    fVar113 = pfVar3[1];
    fVar199 = pfVar3[2];
    fVar245 = pfVar3[3];
    auVar281._0_4_ = fVar112 * 0.5;
    auVar281._4_4_ = fVar113 * 0.5;
    auVar281._8_4_ = fVar199 * 0.5;
    auVar281._12_4_ = fVar245 * 0.5;
    auVar310 = vsubps_avx(auVar248,auVar281);
    auVar282._0_4_ = fVar70 * -0.0 + fVar193 + fVar223 * 0.0 + fVar242 * -0.0;
    auVar282._4_4_ = fVar109 * -0.0 + fVar195 + fVar225 * 0.0 + fVar243 * -0.0;
    auVar282._8_4_ = fVar111 * -0.0 + fVar197 + fVar228 * 0.0 + fVar244 * -0.0;
    auVar282._12_4_ = fVar179 * -0.0 + fVar200 + fVar230 * 0.0 + fVar110 * -0.0;
    local_478._0_4_ = fVar70 * -0.0 + fVar193 * 0.0 + fVar223 + fVar242 * -0.0;
    local_478._4_4_ = fVar109 * -0.0 + fVar195 * 0.0 + fVar225 + fVar243 * -0.0;
    fStack_470 = fVar111 * -0.0 + fVar197 * 0.0 + fVar228 + fVar244 * -0.0;
    fStack_46c = fVar179 * -0.0 + fVar200 * 0.0 + fVar230 + fVar110 * -0.0;
    auVar306._0_4_ = fVar223 * 0.0 + fVar242 * 0.5;
    auVar306._4_4_ = fVar225 * 0.0 + fVar243 * 0.5;
    auVar306._8_4_ = fVar228 * 0.0 + fVar244 * 0.5;
    auVar306._12_4_ = fVar230 * 0.0 + fVar110 * 0.5;
    auVar327._0_4_ = fVar193 * 0.5;
    auVar327._4_4_ = fVar195 * 0.5;
    auVar327._8_4_ = fVar197 * 0.5;
    auVar327._12_4_ = fVar200 * 0.5;
    auVar90 = vsubps_avx(auVar306,auVar327);
    auVar318._0_4_ = fVar70 * 0.0 + auVar90._0_4_;
    auVar318._4_4_ = fVar109 * 0.0 + auVar90._4_4_;
    auVar318._8_4_ = fVar111 * 0.0 + auVar90._8_4_;
    auVar318._12_4_ = fVar179 * 0.0 + auVar90._12_4_;
    auVar307._0_4_ = fVar112 * -0.0 + fVar201 + fVar202 * -0.0 + fVar180 * 0.0;
    auVar307._4_4_ = fVar113 * -0.0 + fVar224 + fVar270 * -0.0 + fVar194 * 0.0;
    auVar307._8_4_ = fVar199 * -0.0 + fVar226 + fVar227 * -0.0 + fVar196 * 0.0;
    auVar307._12_4_ = fVar245 * -0.0 + fVar229 + fVar286 * -0.0 + fVar198 * 0.0;
    auVar119._0_4_ = fVar112 * -0.0 + fVar202 * -0.0 + fVar180 + fVar201 * 0.0;
    auVar119._4_4_ = fVar113 * -0.0 + fVar270 * -0.0 + fVar194 + fVar224 * 0.0;
    auVar119._8_4_ = fVar199 * -0.0 + fVar227 * -0.0 + fVar196 + fVar226 * 0.0;
    auVar119._12_4_ = fVar245 * -0.0 + fVar286 * -0.0 + fVar198 + fVar229 * 0.0;
    auVar153._0_4_ = fVar180 * 0.0 + fVar202 * 0.5;
    auVar153._4_4_ = fVar194 * 0.0 + fVar270 * 0.5;
    auVar153._8_4_ = fVar196 * 0.0 + fVar227 * 0.5;
    auVar153._12_4_ = fVar198 * 0.0 + fVar286 * 0.5;
    auVar185._0_4_ = fVar201 * 0.5;
    auVar185._4_4_ = fVar224 * 0.5;
    auVar185._8_4_ = fVar226 * 0.5;
    auVar185._12_4_ = fVar229 * 0.5;
    auVar90 = vsubps_avx(auVar153,auVar185);
    auVar154._0_4_ = fVar112 * 0.0 + auVar90._0_4_;
    auVar154._4_4_ = fVar113 * 0.0 + auVar90._4_4_;
    auVar154._8_4_ = fVar199 * 0.0 + auVar90._8_4_;
    auVar154._12_4_ = fVar245 * 0.0 + auVar90._12_4_;
    auVar90 = vshufps_avx(auVar307,auVar307,0xc9);
    fVar223 = auVar71._0_4_;
    auVar81._0_4_ = fVar223 * auVar90._0_4_;
    fVar225 = auVar71._4_4_;
    auVar81._4_4_ = fVar225 * auVar90._4_4_;
    fVar228 = auVar71._8_4_;
    auVar81._8_4_ = fVar228 * auVar90._8_4_;
    fVar243 = auVar71._12_4_;
    auVar81._12_4_ = fVar243 * auVar90._12_4_;
    auVar90 = vshufps_avx(auVar71,auVar71,0xc9);
    auVar308._0_4_ = auVar307._0_4_ * auVar90._0_4_;
    auVar308._4_4_ = auVar307._4_4_ * auVar90._4_4_;
    auVar308._8_4_ = auVar307._8_4_ * auVar90._8_4_;
    auVar308._12_4_ = auVar307._12_4_ * auVar90._12_4_;
    auVar176 = vsubps_avx(auVar308,auVar81);
    auVar82._0_4_ = auVar90._0_4_ * auVar310._0_4_;
    auVar82._4_4_ = auVar90._4_4_ * auVar310._4_4_;
    auVar82._8_4_ = auVar90._8_4_ * auVar310._8_4_;
    auVar82._12_4_ = auVar90._12_4_ * auVar310._12_4_;
    auVar90 = vshufps_avx(auVar310,auVar310,0xc9);
    auVar186._0_4_ = fVar223 * auVar90._0_4_;
    auVar186._4_4_ = fVar225 * auVar90._4_4_;
    auVar186._8_4_ = fVar228 * auVar90._8_4_;
    auVar186._12_4_ = fVar243 * auVar90._12_4_;
    auVar280 = vsubps_avx(auVar82,auVar186);
    auVar90 = vshufps_avx(auVar119,auVar119,0xc9);
    auVar83._0_4_ = auVar318._0_4_ * auVar90._0_4_;
    auVar83._4_4_ = auVar318._4_4_ * auVar90._4_4_;
    auVar83._8_4_ = auVar318._8_4_ * auVar90._8_4_;
    auVar83._12_4_ = auVar318._12_4_ * auVar90._12_4_;
    auVar90 = vshufps_avx(auVar318,auVar318,0xc9);
    auVar120._0_4_ = auVar90._0_4_ * auVar119._0_4_;
    auVar120._4_4_ = auVar90._4_4_ * auVar119._4_4_;
    auVar120._8_4_ = auVar90._8_4_ * auVar119._8_4_;
    auVar120._12_4_ = auVar90._12_4_ * auVar119._12_4_;
    auVar14 = vsubps_avx(auVar120,auVar83);
    auVar176 = vshufps_avx(auVar176,auVar176,0xc9);
    auVar121._0_4_ = auVar90._0_4_ * auVar154._0_4_;
    auVar121._4_4_ = auVar90._4_4_ * auVar154._4_4_;
    auVar121._8_4_ = auVar90._8_4_ * auVar154._8_4_;
    auVar121._12_4_ = auVar90._12_4_ * auVar154._12_4_;
    auVar310 = vshufps_avx(auVar154,auVar154,0xc9);
    auVar90 = vdpps_avx(auVar176,auVar176,0x7f);
    auVar155._0_4_ = auVar318._0_4_ * auVar310._0_4_;
    auVar155._4_4_ = auVar318._4_4_ * auVar310._4_4_;
    auVar155._8_4_ = auVar318._8_4_ * auVar310._8_4_;
    auVar155._12_4_ = auVar318._12_4_ * auVar310._12_4_;
    auVar209 = vsubps_avx(auVar121,auVar155);
    auVar280 = vshufps_avx(auVar280,auVar280,0xc9);
    fVar109 = auVar90._0_4_;
    auVar156 = ZEXT416((uint)fVar109);
    auVar310 = vrsqrtss_avx(auVar156,auVar156);
    fVar70 = auVar310._0_4_;
    auVar310 = vdpps_avx(auVar176,auVar280,0x7f);
    auVar90 = vshufps_avx(auVar90,auVar90,0);
    auVar122._0_4_ = auVar90._0_4_ * auVar280._0_4_;
    auVar122._4_4_ = auVar90._4_4_ * auVar280._4_4_;
    auVar122._8_4_ = auVar90._8_4_ * auVar280._8_4_;
    auVar122._12_4_ = auVar90._12_4_ * auVar280._12_4_;
    auVar90 = vshufps_avx(auVar310,auVar310,0);
    auVar309._0_4_ = auVar90._0_4_ * auVar176._0_4_;
    auVar309._4_4_ = auVar90._4_4_ * auVar176._4_4_;
    auVar309._8_4_ = auVar90._8_4_ * auVar176._8_4_;
    auVar309._12_4_ = auVar90._12_4_ * auVar176._12_4_;
    auVar72 = vsubps_avx(auVar122,auVar309);
    auVar90 = vrcpss_avx(auVar156,auVar156);
    auVar90 = ZEXT416((uint)(auVar90._0_4_ * (2.0 - fVar109 * auVar90._0_4_)));
    auVar280 = vshufps_avx(auVar90,auVar90,0);
    auVar14 = vshufps_avx(auVar14,auVar14,0xc9);
    auVar90 = ZEXT416((uint)(fVar70 * 1.5 - fVar109 * 0.5 * fVar70 * fVar70 * fVar70));
    auVar156 = vshufps_avx(auVar90,auVar90,0);
    auVar310 = vdpps_avx(auVar14,auVar14,0x7f);
    fVar70 = auVar176._0_4_ * auVar156._0_4_;
    fVar109 = auVar176._4_4_ * auVar156._4_4_;
    fVar111 = auVar176._8_4_ * auVar156._8_4_;
    fVar179 = auVar176._12_4_ * auVar156._12_4_;
    auVar209 = vshufps_avx(auVar209,auVar209,0xc9);
    auVar90 = vblendps_avx(auVar310,_DAT_01f7aa10,0xe);
    auVar176 = vrsqrtss_avx(auVar90,auVar90);
    fVar193 = auVar176._0_4_;
    auVar176 = vdpps_avx(auVar14,auVar209,0x7f);
    auVar140 = vshufps_avx(auVar310,auVar310,0);
    auVar157._0_4_ = auVar140._0_4_ * auVar209._0_4_;
    auVar157._4_4_ = auVar140._4_4_ * auVar209._4_4_;
    auVar157._8_4_ = auVar140._8_4_ * auVar209._8_4_;
    auVar157._12_4_ = auVar140._12_4_ * auVar209._12_4_;
    auVar176 = vshufps_avx(auVar176,auVar176,0);
    auVar328._0_4_ = auVar176._0_4_ * auVar14._0_4_;
    auVar328._4_4_ = auVar176._4_4_ * auVar14._4_4_;
    auVar328._8_4_ = auVar176._8_4_ * auVar14._8_4_;
    auVar328._12_4_ = auVar176._12_4_ * auVar14._12_4_;
    auVar209 = vsubps_avx(auVar157,auVar328);
    auVar90 = vrcpss_avx(auVar90,auVar90);
    auVar90 = ZEXT416((uint)(auVar90._0_4_ * (2.0 - auVar310._0_4_ * auVar90._0_4_)));
    auVar90 = vshufps_avx(auVar90,auVar90,0);
    auVar310 = ZEXT416((uint)(fVar193 * 1.5 - auVar310._0_4_ * 0.5 * fVar193 * fVar193 * fVar193));
    auVar310 = vshufps_avx(auVar310,auVar310,0);
    fVar193 = auVar14._0_4_ * auVar310._0_4_;
    fVar195 = auVar14._4_4_ * auVar310._4_4_;
    fVar197 = auVar14._8_4_ * auVar310._8_4_;
    fVar200 = auVar14._12_4_ * auVar310._12_4_;
    auVar176 = vshufps_avx(auVar71,auVar71,0xff);
    auVar14 = vshufps_avx(auVar282,auVar282,0xff);
    auVar84._0_4_ = auVar14._0_4_ * fVar70;
    auVar84._4_4_ = auVar14._4_4_ * fVar109;
    auVar84._8_4_ = auVar14._8_4_ * fVar111;
    auVar84._12_4_ = auVar14._12_4_ * fVar179;
    auVar123._0_4_ =
         auVar176._0_4_ * fVar70 + auVar14._0_4_ * auVar156._0_4_ * auVar72._0_4_ * auVar280._0_4_;
    auVar123._4_4_ =
         auVar176._4_4_ * fVar109 + auVar14._4_4_ * auVar156._4_4_ * auVar72._4_4_ * auVar280._4_4_;
    auVar123._8_4_ =
         auVar176._8_4_ * fVar111 + auVar14._8_4_ * auVar156._8_4_ * auVar72._8_4_ * auVar280._8_4_;
    auVar123._12_4_ =
         auVar176._12_4_ * fVar179 +
         auVar14._12_4_ * auVar156._12_4_ * auVar72._12_4_ * auVar280._12_4_;
    auVar14 = vsubps_avx(auVar282,auVar84);
    auVar156 = vsubps_avx(auVar71,auVar123);
    auVar176 = vshufps_avx(auVar318,auVar318,0xff);
    auVar280 = vshufps_avx(_local_478,_local_478,0xff);
    auVar249._0_4_ = auVar280._0_4_ * fVar193;
    auVar249._4_4_ = auVar280._4_4_ * fVar195;
    auVar249._8_4_ = auVar280._8_4_ * fVar197;
    auVar249._12_4_ = auVar280._12_4_ * fVar200;
    auVar124._0_4_ =
         auVar176._0_4_ * fVar193 + auVar280._0_4_ * auVar310._0_4_ * auVar209._0_4_ * auVar90._0_4_
    ;
    auVar124._4_4_ =
         auVar176._4_4_ * fVar195 + auVar280._4_4_ * auVar310._4_4_ * auVar209._4_4_ * auVar90._4_4_
    ;
    auVar124._8_4_ =
         auVar176._8_4_ * fVar197 + auVar280._8_4_ * auVar310._8_4_ * auVar209._8_4_ * auVar90._8_4_
    ;
    auVar124._12_4_ =
         auVar176._12_4_ * fVar200 +
         auVar280._12_4_ * auVar310._12_4_ * auVar209._12_4_ * auVar90._12_4_;
    auVar176 = vsubps_avx(_local_478,auVar249);
    auVar340._0_4_ = (float)local_478._0_4_ + auVar249._0_4_;
    auVar340._4_4_ = (float)local_478._4_4_ + auVar249._4_4_;
    auVar340._8_4_ = fStack_470 + auVar249._8_4_;
    auVar340._12_4_ = fStack_46c + auVar249._12_4_;
    auVar280 = vsubps_avx(auVar318,auVar124);
    local_558 = auVar128._0_4_;
    fStack_554 = auVar128._4_4_;
    fStack_550 = auVar128._8_4_;
    fStack_54c = auVar128._12_4_;
    local_4d8 = auVar162._0_4_;
    fStack_4d4 = auVar162._4_4_;
    fStack_4d0 = auVar162._8_4_;
    fStack_4cc = auVar162._12_4_;
    auVar90 = vshufps_avx(ZEXT416((uint)fVar114),ZEXT416((uint)fVar114),0);
    auVar310 = vshufps_avx(ZEXT416((uint)(1.0 - fVar114)),ZEXT416((uint)(1.0 - fVar114)),0);
    fVar179 = auVar90._0_4_;
    fVar193 = auVar90._4_4_;
    fVar195 = auVar90._8_4_;
    fVar197 = auVar90._12_4_;
    fVar114 = auVar310._0_4_;
    fVar70 = auVar310._4_4_;
    fVar109 = auVar310._8_4_;
    fVar111 = auVar310._12_4_;
    local_398._0_4_ = fVar114 * local_4d8 + fVar179 * auVar14._0_4_;
    local_398._4_4_ = fVar70 * fStack_4d4 + fVar193 * auVar14._4_4_;
    fStack_390 = fVar109 * fStack_4d0 + fVar195 * auVar14._8_4_;
    fStack_38c = fVar111 * fStack_4cc + fVar197 * auVar14._12_4_;
    fVar230 = fVar114 * (local_4d8 + local_558 * 0.33333334) +
              fVar179 * (auVar14._0_4_ + auVar156._0_4_ * 0.33333334);
    fVar244 = fVar70 * (fStack_4d4 + fStack_554 * 0.33333334) +
              fVar193 * (auVar14._4_4_ + auVar156._4_4_ * 0.33333334);
    fVar194 = fVar109 * (fStack_4d0 + fStack_550 * 0.33333334) +
              fVar195 * (auVar14._8_4_ + auVar156._8_4_ * 0.33333334);
    fVar198 = fVar111 * (fStack_4cc + fStack_54c * 0.33333334) +
              fVar197 * (auVar14._12_4_ + auVar156._12_4_ * 0.33333334);
    local_518 = auVar258._0_4_;
    fStack_514 = auVar258._4_4_;
    fStack_510 = auVar258._8_4_;
    fStack_50c = auVar258._12_4_;
    auVar187._0_4_ = local_518 * 0.33333334;
    auVar187._4_4_ = fStack_514 * 0.33333334;
    auVar187._8_4_ = fStack_510 * 0.33333334;
    auVar187._12_4_ = fStack_50c * 0.33333334;
    auVar90 = vsubps_avx(auVar129,auVar187);
    auVar250._0_4_ = (auVar292._0_4_ + auVar79._0_4_) * 0.33333334;
    auVar250._4_4_ = (auVar292._4_4_ + auVar79._4_4_) * 0.33333334;
    auVar250._8_4_ = (auVar292._8_4_ + auVar79._8_4_) * 0.33333334;
    auVar250._12_4_ = (auVar292._12_4_ + auVar79._12_4_) * 0.33333334;
    auVar310 = vsubps_avx(_local_538,auVar250);
    auVar158._0_4_ = auVar280._0_4_ * 0.33333334;
    auVar158._4_4_ = auVar280._4_4_ * 0.33333334;
    auVar158._8_4_ = auVar280._8_4_ * 0.33333334;
    auVar158._12_4_ = auVar280._12_4_ * 0.33333334;
    auVar280 = vsubps_avx(auVar176,auVar158);
    auVar311._0_4_ = (auVar318._0_4_ + auVar124._0_4_) * 0.33333334;
    auVar311._4_4_ = (auVar318._4_4_ + auVar124._4_4_) * 0.33333334;
    auVar311._8_4_ = (auVar318._8_4_ + auVar124._8_4_) * 0.33333334;
    auVar311._12_4_ = (auVar318._12_4_ + auVar124._12_4_) * 0.33333334;
    auVar14 = vsubps_avx(auVar340,auVar311);
    local_3a8._0_4_ = fVar114 * auVar90._0_4_ + fVar179 * auVar280._0_4_;
    local_3a8._4_4_ = fVar70 * auVar90._4_4_ + fVar193 * auVar280._4_4_;
    fStack_3a0 = fVar109 * auVar90._8_4_ + fVar195 * auVar280._8_4_;
    fStack_39c = fVar111 * auVar90._12_4_ + fVar197 * auVar280._12_4_;
    fVar242 = fVar179 * auVar176._0_4_ + fVar114 * auVar129._0_4_;
    fVar110 = fVar193 * auVar176._4_4_ + fVar70 * auVar129._4_4_;
    fVar196 = fVar195 * auVar176._8_4_ + fVar109 * auVar129._8_4_;
    fVar201 = fVar197 * auVar176._12_4_ + fVar111 * auVar129._12_4_;
    local_3b8._0_4_ = (float)local_5c8._0_4_ * fVar114 + fVar179 * (auVar282._0_4_ + auVar84._0_4_);
    local_3b8._4_4_ = (float)local_5c8._4_4_ * fVar70 + fVar193 * (auVar282._4_4_ + auVar84._4_4_);
    fStack_3b0 = fStack_5c0 * fVar109 + fVar195 * (auVar282._8_4_ + auVar84._8_4_);
    fStack_3ac = fStack_5bc * fVar111 + fVar197 * (auVar282._12_4_ + auVar84._12_4_);
    local_3c8._0_4_ =
         fVar114 * ((float)local_5c8._0_4_ + (fVar324 + auVar264._0_4_) * 0.33333334) +
         fVar179 * (auVar282._0_4_ + auVar84._0_4_ + (fVar223 + auVar123._0_4_) * 0.33333334);
    local_3c8._4_4_ =
         fVar70 * ((float)local_5c8._4_4_ + (fVar287 + auVar264._4_4_) * 0.33333334) +
         fVar193 * (auVar282._4_4_ + auVar84._4_4_ + (fVar225 + auVar123._4_4_) * 0.33333334);
    fStack_3c0 = fVar109 * (fStack_5c0 + (fVar332 + auVar264._8_4_) * 0.33333334) +
                 fVar195 * (auVar282._8_4_ + auVar84._8_4_ + (fVar228 + auVar123._8_4_) * 0.33333334
                           );
    fStack_3bc = fVar111 * (fStack_5bc + (fVar288 + auVar264._12_4_) * 0.33333334) +
                 fVar197 * (auVar282._12_4_ + auVar84._12_4_ +
                           (fVar243 + auVar123._12_4_) * 0.33333334);
    local_3d8 = fVar114 * auVar310._0_4_ + fVar179 * auVar14._0_4_;
    fStack_3d4 = fVar70 * auVar310._4_4_ + fVar193 * auVar14._4_4_;
    fStack_3d0 = fVar109 * auVar310._8_4_ + fVar195 * auVar14._8_4_;
    fStack_3cc = fVar111 * auVar310._12_4_ + fVar197 * auVar14._12_4_;
    auVar90 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                            0x1c);
    auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    local_3e8._0_4_ = (float)local_538._0_4_ * fVar114 + fVar179 * auVar340._0_4_;
    local_3e8._4_4_ = (float)local_538._4_4_ * fVar70 + fVar193 * auVar340._4_4_;
    fStack_3e0 = fStack_530 * fVar109 + fVar195 * auVar340._8_4_;
    fStack_3dc = fStack_52c * fVar111 + fVar197 * auVar340._12_4_;
    local_288 = vsubps_avx(_local_398,auVar90);
    auVar176 = vmovsldup_avx(local_288);
    auVar310 = vmovshdup_avx(local_288);
    auVar280 = vshufps_avx(local_288,local_288,0xaa);
    fVar114 = (local_428->vx).field_0.m128[0];
    fVar70 = (local_428->vx).field_0.m128[1];
    fVar109 = (local_428->vx).field_0.m128[2];
    fVar111 = (local_428->vx).field_0.m128[3];
    fVar179 = (local_428->vy).field_0.m128[0];
    fVar193 = (local_428->vy).field_0.m128[1];
    fVar195 = (local_428->vy).field_0.m128[2];
    fVar197 = (local_428->vy).field_0.m128[3];
    fVar200 = (local_428->vz).field_0.m128[0];
    fVar223 = (local_428->vz).field_0.m128[1];
    fVar225 = (local_428->vz).field_0.m128[2];
    fVar228 = (local_428->vz).field_0.m128[3];
    fVar243 = fVar114 * auVar176._0_4_ + fVar179 * auVar310._0_4_ + fVar200 * auVar280._0_4_;
    fVar180 = fVar70 * auVar176._4_4_ + fVar193 * auVar310._4_4_ + fVar223 * auVar280._4_4_;
    local_5b8._4_4_ = fVar180;
    local_5b8._0_4_ = fVar243;
    fStack_5b0 = fVar109 * auVar176._8_4_ + fVar195 * auVar310._8_4_ + fVar225 * auVar280._8_4_;
    fStack_5ac = fVar111 * auVar176._12_4_ + fVar197 * auVar310._12_4_ + fVar228 * auVar280._12_4_;
    auVar57._4_4_ = fVar244;
    auVar57._0_4_ = fVar230;
    auVar57._8_4_ = fVar194;
    auVar57._12_4_ = fVar198;
    local_298 = vsubps_avx(auVar57,auVar90);
    auVar280 = vshufps_avx(local_298,local_298,0xaa);
    auVar310 = vmovshdup_avx(local_298);
    auVar176 = vmovsldup_avx(local_298);
    auVar125._0_4_ = fVar114 * auVar176._0_4_ + fVar179 * auVar310._0_4_ + fVar200 * auVar280._0_4_;
    auVar125._4_4_ = fVar70 * auVar176._4_4_ + fVar193 * auVar310._4_4_ + fVar223 * auVar280._4_4_;
    auVar125._8_4_ = fVar109 * auVar176._8_4_ + fVar195 * auVar310._8_4_ + fVar225 * auVar280._8_4_;
    auVar125._12_4_ =
         fVar111 * auVar176._12_4_ + fVar197 * auVar310._12_4_ + fVar228 * auVar280._12_4_;
    local_2a8 = vsubps_avx(_local_3a8,auVar90);
    auVar280 = vshufps_avx(local_2a8,local_2a8,0xaa);
    auVar310 = vmovshdup_avx(local_2a8);
    auVar176 = vmovsldup_avx(local_2a8);
    auVar341._0_4_ = fVar114 * auVar176._0_4_ + fVar179 * auVar310._0_4_ + fVar200 * auVar280._0_4_;
    auVar341._4_4_ = fVar70 * auVar176._4_4_ + fVar193 * auVar310._4_4_ + fVar223 * auVar280._4_4_;
    auVar341._8_4_ = fVar109 * auVar176._8_4_ + fVar195 * auVar310._8_4_ + fVar225 * auVar280._8_4_;
    auVar341._12_4_ =
         fVar111 * auVar176._12_4_ + fVar197 * auVar310._12_4_ + fVar228 * auVar280._12_4_;
    auVar55._4_4_ = fVar110;
    auVar55._0_4_ = fVar242;
    auVar55._8_4_ = fVar196;
    auVar55._12_4_ = fVar201;
    local_2b8 = vsubps_avx(auVar55,auVar90);
    auVar280 = vshufps_avx(local_2b8,local_2b8,0xaa);
    auVar310 = vmovshdup_avx(local_2b8);
    auVar176 = vmovsldup_avx(local_2b8);
    auVar265._0_4_ = auVar176._0_4_ * fVar114 + auVar310._0_4_ * fVar179 + fVar200 * auVar280._0_4_;
    auVar265._4_4_ = auVar176._4_4_ * fVar70 + auVar310._4_4_ * fVar193 + fVar223 * auVar280._4_4_;
    auVar265._8_4_ = auVar176._8_4_ * fVar109 + auVar310._8_4_ * fVar195 + fVar225 * auVar280._8_4_;
    auVar265._12_4_ =
         auVar176._12_4_ * fVar111 + auVar310._12_4_ * fVar197 + fVar228 * auVar280._12_4_;
    local_2c8 = vsubps_avx(_local_3b8,auVar90);
    auVar280 = vshufps_avx(local_2c8,local_2c8,0xaa);
    auVar310 = vmovshdup_avx(local_2c8);
    auVar176 = vmovsldup_avx(local_2c8);
    auVar329._0_4_ = auVar176._0_4_ * fVar114 + auVar310._0_4_ * fVar179 + auVar280._0_4_ * fVar200;
    auVar329._4_4_ = auVar176._4_4_ * fVar70 + auVar310._4_4_ * fVar193 + auVar280._4_4_ * fVar223;
    auVar329._8_4_ = auVar176._8_4_ * fVar109 + auVar310._8_4_ * fVar195 + auVar280._8_4_ * fVar225;
    auVar329._12_4_ =
         auVar176._12_4_ * fVar111 + auVar310._12_4_ * fVar197 + auVar280._12_4_ * fVar228;
    local_2d8 = vsubps_avx(_local_3c8,auVar90);
    auVar280 = vshufps_avx(local_2d8,local_2d8,0xaa);
    auVar310 = vmovshdup_avx(local_2d8);
    auVar176 = vmovsldup_avx(local_2d8);
    auVar293._0_4_ = auVar176._0_4_ * fVar114 + auVar310._0_4_ * fVar179 + auVar280._0_4_ * fVar200;
    auVar293._4_4_ = auVar176._4_4_ * fVar70 + auVar310._4_4_ * fVar193 + auVar280._4_4_ * fVar223;
    auVar293._8_4_ = auVar176._8_4_ * fVar109 + auVar310._8_4_ * fVar195 + auVar280._8_4_ * fVar225;
    auVar293._12_4_ =
         auVar176._12_4_ * fVar111 + auVar310._12_4_ * fVar197 + auVar280._12_4_ * fVar228;
    auVar59._4_4_ = fStack_3d4;
    auVar59._0_4_ = local_3d8;
    auVar59._8_4_ = fStack_3d0;
    auVar59._12_4_ = fStack_3cc;
    local_2e8 = vsubps_avx(auVar59,auVar90);
    auVar280 = vshufps_avx(local_2e8,local_2e8,0xaa);
    auVar310 = vmovshdup_avx(local_2e8);
    auVar176 = vmovsldup_avx(local_2e8);
    auVar312._0_4_ = auVar176._0_4_ * fVar114 + auVar310._0_4_ * fVar179 + auVar280._0_4_ * fVar200;
    auVar312._4_4_ = auVar176._4_4_ * fVar70 + auVar310._4_4_ * fVar193 + auVar280._4_4_ * fVar223;
    auVar312._8_4_ = auVar176._8_4_ * fVar109 + auVar310._8_4_ * fVar195 + auVar280._8_4_ * fVar225;
    auVar312._12_4_ =
         auVar176._12_4_ * fVar111 + auVar310._12_4_ * fVar197 + auVar280._12_4_ * fVar228;
    local_2f8 = vsubps_avx(_local_3e8,auVar90);
    auVar176 = vshufps_avx(local_2f8,local_2f8,0xaa);
    auVar90 = vmovshdup_avx(local_2f8);
    auVar310 = vmovsldup_avx(local_2f8);
    auVar85._0_4_ = fVar114 * auVar310._0_4_ + fVar179 * auVar90._0_4_ + fVar200 * auVar176._0_4_;
    auVar85._4_4_ = fVar70 * auVar310._4_4_ + fVar193 * auVar90._4_4_ + fVar223 * auVar176._4_4_;
    auVar85._8_4_ = fVar109 * auVar310._8_4_ + fVar195 * auVar90._8_4_ + fVar225 * auVar176._8_4_;
    auVar85._12_4_ =
         fVar111 * auVar310._12_4_ + fVar197 * auVar90._12_4_ + fVar228 * auVar176._12_4_;
    auVar280 = vmovlhps_avx(_local_5b8,auVar329);
    auVar14 = vmovlhps_avx(auVar125,auVar293);
    auVar156 = vmovlhps_avx(auVar341,auVar312);
    auVar209 = vmovlhps_avx(auVar265,auVar85);
    auVar90 = vminps_avx(auVar280,auVar14);
    auVar310 = vminps_avx(auVar156,auVar209);
    auVar176 = vminps_avx(auVar90,auVar310);
    auVar90 = vmaxps_avx(auVar280,auVar14);
    auVar310 = vmaxps_avx(auVar156,auVar209);
    auVar90 = vmaxps_avx(auVar90,auVar310);
    auVar310 = vshufpd_avx(auVar176,auVar176,3);
    auVar176 = vminps_avx(auVar176,auVar310);
    auVar310 = vshufpd_avx(auVar90,auVar90,3);
    auVar310 = vmaxps_avx(auVar90,auVar310);
    auVar251._8_4_ = 0x7fffffff;
    auVar251._0_8_ = 0x7fffffff7fffffff;
    auVar251._12_4_ = 0x7fffffff;
    auVar90 = vandps_avx(auVar176,auVar251);
    auVar310 = vandps_avx(auVar310,auVar251);
    auVar90 = vmaxps_avx(auVar90,auVar310);
    auVar310 = vmovshdup_avx(auVar90);
    auVar90 = vmaxss_avx(auVar310,auVar90);
    fVar70 = auVar90._0_4_ * 9.536743e-07;
    auVar90 = vshufps_avx(ZEXT416((uint)fVar70),ZEXT416((uint)fVar70),0);
    local_78._16_16_ = auVar90;
    local_78._0_16_ = auVar90;
    auVar86._0_8_ = auVar90._0_8_ ^ 0x8000000080000000;
    auVar86._8_4_ = auVar90._8_4_ ^ 0x80000000;
    auVar86._12_4_ = auVar90._12_4_ ^ 0x80000000;
    local_248._16_16_ = auVar86;
    local_248._0_16_ = auVar86;
    local_368 = vpshufd_avx(ZEXT416(uVar62),0);
    local_378 = vpshufd_avx(ZEXT416(uVar7),0);
    uVar69 = 0;
    fVar114 = *(float *)(ray + k * 4 + 0x30);
    _local_258 = vsubps_avx(auVar14,auVar280);
    _local_268 = vsubps_avx(auVar156,auVar14);
    _local_278 = vsubps_avx(auVar209,auVar156);
    _local_318 = vsubps_avx(_local_3b8,_local_398);
    auVar58._4_4_ = fVar244;
    auVar58._0_4_ = fVar230;
    auVar58._8_4_ = fVar194;
    auVar58._12_4_ = fVar198;
    _local_328 = vsubps_avx(_local_3c8,auVar58);
    _local_338 = vsubps_avx(auVar59,_local_3a8);
    auVar56._4_4_ = fVar110;
    auVar56._0_4_ = fVar242;
    auVar56._8_4_ = fVar196;
    auVar56._12_4_ = fVar201;
    _local_348 = vsubps_avx(_local_3e8,auVar56);
    auVar350 = ZEXT1664(ZEXT816(0x3f80000000000000));
    auVar354 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_00fb7111:
    local_308 = auVar354._0_16_;
    auVar73 = auVar350._0_16_;
    auVar90 = vshufps_avx(auVar73,auVar73,0x50);
    auVar345._8_4_ = 0x3f800000;
    auVar345._0_8_ = 0x3f8000003f800000;
    auVar345._12_4_ = 0x3f800000;
    auVar349._16_4_ = 0x3f800000;
    auVar349._0_16_ = auVar345;
    auVar349._20_4_ = 0x3f800000;
    auVar349._24_4_ = 0x3f800000;
    auVar349._28_4_ = 0x3f800000;
    auVar310 = vsubps_avx(auVar345,auVar90);
    fVar109 = auVar90._0_4_;
    fVar111 = auVar90._4_4_;
    fVar179 = auVar90._8_4_;
    fVar193 = auVar90._12_4_;
    fVar195 = auVar310._0_4_;
    fVar197 = auVar310._4_4_;
    fVar200 = auVar310._8_4_;
    fVar223 = auVar310._12_4_;
    auVar188._0_4_ = auVar329._0_4_ * fVar109 + fVar195 * fVar243;
    auVar188._4_4_ = auVar329._4_4_ * fVar111 + fVar197 * fVar180;
    auVar188._8_4_ = auVar329._0_4_ * fVar179 + fVar200 * fVar243;
    auVar188._12_4_ = auVar329._4_4_ * fVar193 + fVar223 * fVar180;
    auVar159._0_4_ = auVar293._0_4_ * fVar109 + fVar195 * auVar125._0_4_;
    auVar159._4_4_ = auVar293._4_4_ * fVar111 + fVar197 * auVar125._4_4_;
    auVar159._8_4_ = auVar293._0_4_ * fVar179 + fVar200 * auVar125._0_4_;
    auVar159._12_4_ = auVar293._4_4_ * fVar193 + fVar223 * auVar125._4_4_;
    auVar266._0_4_ = auVar312._0_4_ * fVar109 + auVar341._0_4_ * fVar195;
    auVar266._4_4_ = auVar312._4_4_ * fVar111 + auVar341._4_4_ * fVar197;
    auVar266._8_4_ = auVar312._0_4_ * fVar179 + auVar341._0_4_ * fVar200;
    auVar266._12_4_ = auVar312._4_4_ * fVar193 + auVar341._4_4_ * fVar223;
    auVar210._0_4_ = auVar85._0_4_ * fVar109 + auVar265._0_4_ * fVar195;
    auVar210._4_4_ = auVar85._4_4_ * fVar111 + auVar265._4_4_ * fVar197;
    auVar210._8_4_ = auVar85._0_4_ * fVar179 + auVar265._0_4_ * fVar200;
    auVar210._12_4_ = auVar85._4_4_ * fVar193 + auVar265._4_4_ * fVar223;
    auVar90 = vmovshdup_avx(local_308);
    auVar310 = vshufps_avx(local_308,local_308,0);
    auVar297._16_16_ = auVar310;
    auVar297._0_16_ = auVar310;
    auVar176 = vshufps_avx(local_308,local_308,0x55);
    auVar104._16_16_ = auVar176;
    auVar104._0_16_ = auVar176;
    auVar103 = vsubps_avx(auVar104,auVar297);
    auVar176 = vshufps_avx(auVar188,auVar188,0);
    auVar140 = vshufps_avx(auVar188,auVar188,0x55);
    auVar128 = vshufps_avx(auVar159,auVar159,0);
    auVar162 = vshufps_avx(auVar159,auVar159,0x55);
    auVar129 = vshufps_avx(auVar266,auVar266,0);
    auVar258 = vshufps_avx(auVar266,auVar266,0x55);
    auVar71 = vshufps_avx(auVar210,auVar210,0);
    auVar72 = vshufps_avx(auVar210,auVar210,0x55);
    auVar90 = ZEXT416((uint)((auVar90._0_4_ - auVar354._0_4_) * 0.04761905));
    auVar90 = vshufps_avx(auVar90,auVar90,0);
    auVar316._0_4_ = auVar310._0_4_ + auVar103._0_4_ * 0.0;
    auVar316._4_4_ = auVar310._4_4_ + auVar103._4_4_ * 0.14285715;
    auVar316._8_4_ = auVar310._8_4_ + auVar103._8_4_ * 0.2857143;
    auVar316._12_4_ = auVar310._12_4_ + auVar103._12_4_ * 0.42857146;
    auVar316._16_4_ = auVar310._0_4_ + auVar103._16_4_ * 0.5714286;
    auVar316._20_4_ = auVar310._4_4_ + auVar103._20_4_ * 0.71428573;
    auVar316._24_4_ = auVar310._8_4_ + auVar103._24_4_ * 0.8571429;
    auVar316._28_4_ = auVar310._12_4_ + auVar103._28_4_;
    auVar15 = vsubps_avx(auVar349,auVar316);
    fVar109 = auVar128._0_4_;
    fVar179 = auVar128._4_4_;
    fVar195 = auVar128._8_4_;
    fVar200 = auVar128._12_4_;
    fVar290 = auVar15._0_4_;
    fVar299 = auVar15._4_4_;
    fVar300 = auVar15._8_4_;
    fVar301 = auVar15._12_4_;
    fVar302 = auVar15._16_4_;
    fVar303 = auVar15._20_4_;
    fVar304 = auVar15._24_4_;
    fVar286 = auVar162._0_4_;
    fVar287 = auVar162._4_4_;
    fVar288 = auVar162._8_4_;
    fVar289 = auVar162._12_4_;
    fVar343 = auVar140._12_4_ + 1.0;
    fVar245 = auVar129._0_4_;
    fVar202 = auVar129._4_4_;
    fVar270 = auVar129._8_4_;
    fVar227 = auVar129._12_4_;
    fVar225 = fVar245 * auVar316._0_4_ + fVar290 * fVar109;
    fVar228 = fVar202 * auVar316._4_4_ + fVar299 * fVar179;
    fVar224 = fVar270 * auVar316._8_4_ + fVar300 * fVar195;
    fVar226 = fVar227 * auVar316._12_4_ + fVar301 * fVar200;
    fVar229 = fVar245 * auVar316._16_4_ + fVar302 * fVar109;
    fVar112 = fVar202 * auVar316._20_4_ + fVar303 * fVar179;
    fVar113 = fVar270 * auVar316._24_4_ + fVar304 * fVar195;
    fVar111 = auVar258._0_4_;
    fVar193 = auVar258._4_4_;
    fVar197 = auVar258._8_4_;
    fVar223 = auVar258._12_4_;
    fVar324 = fVar286 * fVar290 + auVar316._0_4_ * fVar111;
    fVar332 = fVar287 * fVar299 + auVar316._4_4_ * fVar193;
    fVar333 = fVar288 * fVar300 + auVar316._8_4_ * fVar197;
    fVar334 = fVar289 * fVar301 + auVar316._12_4_ * fVar223;
    fVar335 = fVar286 * fVar302 + auVar316._16_4_ * fVar111;
    fVar336 = fVar287 * fVar303 + auVar316._20_4_ * fVar193;
    fVar337 = fVar288 * fVar304 + auVar316._24_4_ * fVar197;
    fVar338 = fVar289 + fVar200;
    auVar310 = vshufps_avx(auVar188,auVar188,0xaa);
    auVar128 = vshufps_avx(auVar188,auVar188,0xff);
    fVar199 = fVar227 + 0.0;
    auVar162 = vshufps_avx(auVar159,auVar159,0xaa);
    auVar129 = vshufps_avx(auVar159,auVar159,0xff);
    auVar221._0_4_ =
         fVar290 * (auVar316._0_4_ * fVar109 + fVar290 * auVar176._0_4_) + auVar316._0_4_ * fVar225;
    auVar221._4_4_ =
         fVar299 * (auVar316._4_4_ * fVar179 + fVar299 * auVar176._4_4_) + auVar316._4_4_ * fVar228;
    auVar221._8_4_ =
         fVar300 * (auVar316._8_4_ * fVar195 + fVar300 * auVar176._8_4_) + auVar316._8_4_ * fVar224;
    auVar221._12_4_ =
         fVar301 * (auVar316._12_4_ * fVar200 + fVar301 * auVar176._12_4_) +
         auVar316._12_4_ * fVar226;
    auVar221._16_4_ =
         fVar302 * (auVar316._16_4_ * fVar109 + fVar302 * auVar176._0_4_) +
         auVar316._16_4_ * fVar229;
    auVar221._20_4_ =
         fVar303 * (auVar316._20_4_ * fVar179 + fVar303 * auVar176._4_4_) +
         auVar316._20_4_ * fVar112;
    auVar221._24_4_ =
         fVar304 * (auVar316._24_4_ * fVar195 + fVar304 * auVar176._8_4_) +
         auVar316._24_4_ * fVar113;
    auVar221._28_4_ = auVar176._12_4_ + 1.0 + fVar223;
    auVar240._0_4_ =
         fVar290 * (fVar286 * auVar316._0_4_ + auVar140._0_4_ * fVar290) + auVar316._0_4_ * fVar324;
    auVar240._4_4_ =
         fVar299 * (fVar287 * auVar316._4_4_ + auVar140._4_4_ * fVar299) + auVar316._4_4_ * fVar332;
    auVar240._8_4_ =
         fVar300 * (fVar288 * auVar316._8_4_ + auVar140._8_4_ * fVar300) + auVar316._8_4_ * fVar333;
    auVar240._12_4_ =
         fVar301 * (fVar289 * auVar316._12_4_ + auVar140._12_4_ * fVar301) +
         auVar316._12_4_ * fVar334;
    auVar240._16_4_ =
         fVar302 * (fVar286 * auVar316._16_4_ + auVar140._0_4_ * fVar302) +
         auVar316._16_4_ * fVar335;
    auVar240._20_4_ =
         fVar303 * (fVar287 * auVar316._20_4_ + auVar140._4_4_ * fVar303) +
         auVar316._20_4_ * fVar336;
    auVar240._24_4_ =
         fVar304 * (fVar288 * auVar316._24_4_ + auVar140._8_4_ * fVar304) +
         auVar316._24_4_ * fVar337;
    auVar240._28_4_ = auVar72._12_4_ + fVar223;
    auVar105._0_4_ =
         fVar290 * fVar225 + auVar316._0_4_ * (fVar245 * fVar290 + auVar71._0_4_ * auVar316._0_4_);
    auVar105._4_4_ =
         fVar299 * fVar228 + auVar316._4_4_ * (fVar202 * fVar299 + auVar71._4_4_ * auVar316._4_4_);
    auVar105._8_4_ =
         fVar300 * fVar224 + auVar316._8_4_ * (fVar270 * fVar300 + auVar71._8_4_ * auVar316._8_4_);
    auVar105._12_4_ =
         fVar301 * fVar226 +
         auVar316._12_4_ * (fVar227 * fVar301 + auVar71._12_4_ * auVar316._12_4_);
    auVar105._16_4_ =
         fVar302 * fVar229 + auVar316._16_4_ * (fVar245 * fVar302 + auVar71._0_4_ * auVar316._16_4_)
    ;
    auVar105._20_4_ =
         fVar303 * fVar112 + auVar316._20_4_ * (fVar202 * fVar303 + auVar71._4_4_ * auVar316._20_4_)
    ;
    auVar105._24_4_ =
         fVar304 * fVar113 + auVar316._24_4_ * (fVar270 * fVar304 + auVar71._8_4_ * auVar316._24_4_)
    ;
    auVar105._28_4_ = fVar200 + 1.0 + fVar199;
    auVar323._0_4_ =
         fVar290 * fVar324 + auVar316._0_4_ * (auVar72._0_4_ * auVar316._0_4_ + fVar290 * fVar111);
    auVar323._4_4_ =
         fVar299 * fVar332 + auVar316._4_4_ * (auVar72._4_4_ * auVar316._4_4_ + fVar299 * fVar193);
    auVar323._8_4_ =
         fVar300 * fVar333 + auVar316._8_4_ * (auVar72._8_4_ * auVar316._8_4_ + fVar300 * fVar197);
    auVar323._12_4_ =
         fVar301 * fVar334 +
         auVar316._12_4_ * (auVar72._12_4_ * auVar316._12_4_ + fVar301 * fVar223);
    auVar323._16_4_ =
         fVar302 * fVar335 + auVar316._16_4_ * (auVar72._0_4_ * auVar316._16_4_ + fVar302 * fVar111)
    ;
    auVar323._20_4_ =
         fVar303 * fVar336 + auVar316._20_4_ * (auVar72._4_4_ * auVar316._20_4_ + fVar303 * fVar193)
    ;
    auVar323._24_4_ =
         fVar304 * fVar337 + auVar316._24_4_ * (auVar72._8_4_ * auVar316._24_4_ + fVar304 * fVar197)
    ;
    auVar323._28_4_ = fVar199 + fVar223 + 0.0;
    local_b8._0_4_ = fVar290 * auVar221._0_4_ + auVar316._0_4_ * auVar105._0_4_;
    local_b8._4_4_ = fVar299 * auVar221._4_4_ + auVar316._4_4_ * auVar105._4_4_;
    local_b8._8_4_ = fVar300 * auVar221._8_4_ + auVar316._8_4_ * auVar105._8_4_;
    local_b8._12_4_ = fVar301 * auVar221._12_4_ + auVar316._12_4_ * auVar105._12_4_;
    local_b8._16_4_ = fVar302 * auVar221._16_4_ + auVar316._16_4_ * auVar105._16_4_;
    local_b8._20_4_ = fVar303 * auVar221._20_4_ + auVar316._20_4_ * auVar105._20_4_;
    local_b8._24_4_ = fVar304 * auVar221._24_4_ + auVar316._24_4_ * auVar105._24_4_;
    local_b8._28_4_ = fVar338 + fVar223 + 0.0;
    auVar192._0_4_ = fVar290 * auVar240._0_4_ + auVar316._0_4_ * auVar323._0_4_;
    auVar192._4_4_ = fVar299 * auVar240._4_4_ + auVar316._4_4_ * auVar323._4_4_;
    auVar192._8_4_ = fVar300 * auVar240._8_4_ + auVar316._8_4_ * auVar323._8_4_;
    auVar192._12_4_ = fVar301 * auVar240._12_4_ + auVar316._12_4_ * auVar323._12_4_;
    auVar192._16_4_ = fVar302 * auVar240._16_4_ + auVar316._16_4_ * auVar323._16_4_;
    auVar192._20_4_ = fVar303 * auVar240._20_4_ + auVar316._20_4_ * auVar323._20_4_;
    auVar192._24_4_ = fVar304 * auVar240._24_4_ + auVar316._24_4_ * auVar323._24_4_;
    auVar192._28_4_ = fVar338 + fVar199;
    auVar16 = vsubps_avx(auVar105,auVar221);
    auVar103 = vsubps_avx(auVar323,auVar240);
    local_4f8 = auVar90._0_4_;
    fStack_4f4 = auVar90._4_4_;
    fStack_4f0 = auVar90._8_4_;
    fStack_4ec = auVar90._12_4_;
    local_f8 = local_4f8 * auVar16._0_4_ * 3.0;
    fStack_f4 = fStack_4f4 * auVar16._4_4_ * 3.0;
    auVar17._4_4_ = fStack_f4;
    auVar17._0_4_ = local_f8;
    fStack_f0 = fStack_4f0 * auVar16._8_4_ * 3.0;
    auVar17._8_4_ = fStack_f0;
    fStack_ec = fStack_4ec * auVar16._12_4_ * 3.0;
    auVar17._12_4_ = fStack_ec;
    fStack_e8 = local_4f8 * auVar16._16_4_ * 3.0;
    auVar17._16_4_ = fStack_e8;
    fStack_e4 = fStack_4f4 * auVar16._20_4_ * 3.0;
    auVar17._20_4_ = fStack_e4;
    fStack_e0 = fStack_4f0 * auVar16._24_4_ * 3.0;
    auVar17._24_4_ = fStack_e0;
    auVar17._28_4_ = auVar16._28_4_;
    local_118 = local_4f8 * auVar103._0_4_ * 3.0;
    fStack_114 = fStack_4f4 * auVar103._4_4_ * 3.0;
    auVar18._4_4_ = fStack_114;
    auVar18._0_4_ = local_118;
    fStack_110 = fStack_4f0 * auVar103._8_4_ * 3.0;
    auVar18._8_4_ = fStack_110;
    fStack_10c = fStack_4ec * auVar103._12_4_ * 3.0;
    auVar18._12_4_ = fStack_10c;
    fStack_108 = local_4f8 * auVar103._16_4_ * 3.0;
    auVar18._16_4_ = fStack_108;
    fStack_104 = fStack_4f4 * auVar103._20_4_ * 3.0;
    auVar18._20_4_ = fStack_104;
    fStack_100 = fStack_4f0 * auVar103._24_4_ * 3.0;
    auVar18._24_4_ = fStack_100;
    auVar18._28_4_ = fVar338;
    auVar17 = vsubps_avx(local_b8,auVar17);
    auVar103 = vperm2f128_avx(auVar17,auVar17,1);
    auVar103 = vshufps_avx(auVar103,auVar17,0x30);
    auVar103 = vshufps_avx(auVar17,auVar103,0x29);
    auVar18 = vsubps_avx(auVar192,auVar18);
    auVar17 = vperm2f128_avx(auVar18,auVar18,1);
    auVar17 = vshufps_avx(auVar17,auVar18,0x30);
    auVar18 = vshufps_avx(auVar18,auVar17,0x29);
    fVar336 = auVar162._0_4_;
    fVar337 = auVar162._4_4_;
    fVar355 = auVar162._8_4_;
    fVar200 = auVar310._12_4_;
    fVar202 = auVar129._0_4_;
    fVar227 = auVar129._4_4_;
    fVar324 = auVar129._8_4_;
    fVar332 = auVar129._12_4_;
    auVar90 = vshufps_avx(auVar266,auVar266,0xaa);
    fVar109 = auVar90._0_4_;
    fVar179 = auVar90._4_4_;
    fVar195 = auVar90._8_4_;
    fVar223 = auVar90._12_4_;
    fVar224 = auVar316._0_4_ * fVar109 + fVar336 * fVar290;
    fVar226 = auVar316._4_4_ * fVar179 + fVar337 * fVar299;
    fVar229 = auVar316._8_4_ * fVar195 + fVar355 * fVar300;
    fVar112 = auVar316._12_4_ * fVar223 + auVar162._12_4_ * fVar301;
    fVar113 = auVar316._16_4_ * fVar109 + fVar336 * fVar302;
    fVar199 = auVar316._20_4_ * fVar179 + fVar337 * fVar303;
    fVar245 = auVar316._24_4_ * fVar195 + fVar355 * fVar304;
    auVar90 = vshufps_avx(auVar266,auVar266,0xff);
    fVar111 = auVar90._0_4_;
    fVar193 = auVar90._4_4_;
    fVar197 = auVar90._8_4_;
    fVar225 = auVar90._12_4_;
    fVar270 = auVar316._0_4_ * fVar111 + fVar202 * fVar290;
    fVar286 = auVar316._4_4_ * fVar193 + fVar227 * fVar299;
    fVar287 = auVar316._8_4_ * fVar197 + fVar324 * fVar300;
    fVar288 = auVar316._12_4_ * fVar225 + fVar332 * fVar301;
    fVar333 = auVar316._16_4_ * fVar111 + fVar202 * fVar302;
    fVar289 = auVar316._20_4_ * fVar193 + fVar227 * fVar303;
    fVar334 = auVar316._24_4_ * fVar197 + fVar324 * fVar304;
    auVar90 = vshufps_avx(auVar210,auVar210,0xaa);
    fVar335 = auVar90._12_4_ + fVar223;
    auVar176 = vshufps_avx(auVar210,auVar210,0xff);
    fVar228 = auVar176._12_4_;
    auVar106._0_4_ =
         fVar290 * (fVar336 * auVar316._0_4_ + fVar290 * auVar310._0_4_) + auVar316._0_4_ * fVar224;
    auVar106._4_4_ =
         fVar299 * (fVar337 * auVar316._4_4_ + fVar299 * auVar310._4_4_) + auVar316._4_4_ * fVar226;
    auVar106._8_4_ =
         fVar300 * (fVar355 * auVar316._8_4_ + fVar300 * auVar310._8_4_) + auVar316._8_4_ * fVar229;
    auVar106._12_4_ =
         fVar301 * (auVar162._12_4_ * auVar316._12_4_ + fVar301 * fVar200) +
         auVar316._12_4_ * fVar112;
    auVar106._16_4_ =
         fVar302 * (fVar336 * auVar316._16_4_ + fVar302 * auVar310._0_4_) +
         auVar316._16_4_ * fVar113;
    auVar106._20_4_ =
         fVar303 * (fVar337 * auVar316._20_4_ + fVar303 * auVar310._4_4_) +
         auVar316._20_4_ * fVar199;
    auVar106._24_4_ =
         fVar304 * (fVar355 * auVar316._24_4_ + fVar304 * auVar310._8_4_) +
         auVar316._24_4_ * fVar245;
    auVar106._28_4_ = auVar18._28_4_ + fVar200 + fVar228;
    auVar144._0_4_ =
         fVar290 * (fVar202 * auVar316._0_4_ + auVar128._0_4_ * fVar290) + auVar316._0_4_ * fVar270;
    auVar144._4_4_ =
         fVar299 * (fVar227 * auVar316._4_4_ + auVar128._4_4_ * fVar299) + auVar316._4_4_ * fVar286;
    auVar144._8_4_ =
         fVar300 * (fVar324 * auVar316._8_4_ + auVar128._8_4_ * fVar300) + auVar316._8_4_ * fVar287;
    auVar144._12_4_ =
         fVar301 * (fVar332 * auVar316._12_4_ + auVar128._12_4_ * fVar301) +
         auVar316._12_4_ * fVar288;
    auVar144._16_4_ =
         fVar302 * (fVar202 * auVar316._16_4_ + auVar128._0_4_ * fVar302) +
         auVar316._16_4_ * fVar333;
    auVar144._20_4_ =
         fVar303 * (fVar227 * auVar316._20_4_ + auVar128._4_4_ * fVar303) +
         auVar316._20_4_ * fVar289;
    auVar144._24_4_ =
         fVar304 * (fVar324 * auVar316._24_4_ + auVar128._8_4_ * fVar304) +
         auVar316._24_4_ * fVar334;
    auVar144._28_4_ = fVar200 + auVar17._28_4_ + fVar228;
    auVar17 = vperm2f128_avx(local_b8,local_b8,1);
    auVar17 = vshufps_avx(auVar17,local_b8,0x30);
    auVar104 = vshufps_avx(local_b8,auVar17,0x29);
    auVar241._0_4_ =
         auVar316._0_4_ * (auVar90._0_4_ * auVar316._0_4_ + fVar290 * fVar109) + fVar290 * fVar224;
    auVar241._4_4_ =
         auVar316._4_4_ * (auVar90._4_4_ * auVar316._4_4_ + fVar299 * fVar179) + fVar299 * fVar226;
    auVar241._8_4_ =
         auVar316._8_4_ * (auVar90._8_4_ * auVar316._8_4_ + fVar300 * fVar195) + fVar300 * fVar229;
    auVar241._12_4_ =
         auVar316._12_4_ * (auVar90._12_4_ * auVar316._12_4_ + fVar301 * fVar223) +
         fVar301 * fVar112;
    auVar241._16_4_ =
         auVar316._16_4_ * (auVar90._0_4_ * auVar316._16_4_ + fVar302 * fVar109) + fVar302 * fVar113
    ;
    auVar241._20_4_ =
         auVar316._20_4_ * (auVar90._4_4_ * auVar316._20_4_ + fVar303 * fVar179) + fVar303 * fVar199
    ;
    auVar241._24_4_ =
         auVar316._24_4_ * (auVar90._8_4_ * auVar316._24_4_ + fVar304 * fVar195) + fVar304 * fVar245
    ;
    auVar241._28_4_ = fVar335 + fVar343 + auVar240._28_4_;
    auVar285._0_4_ =
         fVar290 * fVar270 + auVar316._0_4_ * (auVar316._0_4_ * auVar176._0_4_ + fVar290 * fVar111);
    auVar285._4_4_ =
         fVar299 * fVar286 + auVar316._4_4_ * (auVar316._4_4_ * auVar176._4_4_ + fVar299 * fVar193);
    auVar285._8_4_ =
         fVar300 * fVar287 + auVar316._8_4_ * (auVar316._8_4_ * auVar176._8_4_ + fVar300 * fVar197);
    auVar285._12_4_ =
         fVar301 * fVar288 + auVar316._12_4_ * (auVar316._12_4_ * fVar228 + fVar301 * fVar225);
    auVar285._16_4_ =
         fVar302 * fVar333 +
         auVar316._16_4_ * (auVar316._16_4_ * auVar176._0_4_ + fVar302 * fVar111);
    auVar285._20_4_ =
         fVar303 * fVar289 +
         auVar316._20_4_ * (auVar316._20_4_ * auVar176._4_4_ + fVar303 * fVar193);
    auVar285._24_4_ =
         fVar304 * fVar334 +
         auVar316._24_4_ * (auVar316._24_4_ * auVar176._8_4_ + fVar304 * fVar197);
    auVar285._28_4_ = fVar343 + fVar332 + fVar228 + fVar225;
    auVar269._0_4_ = fVar290 * auVar106._0_4_ + auVar316._0_4_ * auVar241._0_4_;
    auVar269._4_4_ = fVar299 * auVar106._4_4_ + auVar316._4_4_ * auVar241._4_4_;
    auVar269._8_4_ = fVar300 * auVar106._8_4_ + auVar316._8_4_ * auVar241._8_4_;
    auVar269._12_4_ = fVar301 * auVar106._12_4_ + auVar316._12_4_ * auVar241._12_4_;
    auVar269._16_4_ = fVar302 * auVar106._16_4_ + auVar316._16_4_ * auVar241._16_4_;
    auVar269._20_4_ = fVar303 * auVar106._20_4_ + auVar316._20_4_ * auVar241._20_4_;
    auVar269._24_4_ = fVar304 * auVar106._24_4_ + auVar316._24_4_ * auVar241._24_4_;
    auVar269._28_4_ = fVar335 + fVar228 + fVar225;
    auVar298._0_4_ = fVar290 * auVar144._0_4_ + auVar316._0_4_ * auVar285._0_4_;
    auVar298._4_4_ = fVar299 * auVar144._4_4_ + auVar316._4_4_ * auVar285._4_4_;
    auVar298._8_4_ = fVar300 * auVar144._8_4_ + auVar316._8_4_ * auVar285._8_4_;
    auVar298._12_4_ = fVar301 * auVar144._12_4_ + auVar316._12_4_ * auVar285._12_4_;
    auVar298._16_4_ = fVar302 * auVar144._16_4_ + auVar316._16_4_ * auVar285._16_4_;
    auVar298._20_4_ = fVar303 * auVar144._20_4_ + auVar316._20_4_ * auVar285._20_4_;
    auVar298._24_4_ = fVar304 * auVar144._24_4_ + auVar316._24_4_ * auVar285._24_4_;
    auVar298._28_4_ = auVar15._28_4_ + auVar316._28_4_;
    auVar19 = vsubps_avx(auVar241,auVar106);
    auVar17 = vsubps_avx(auVar285,auVar144);
    local_138 = local_4f8 * auVar19._0_4_ * 3.0;
    fStack_134 = fStack_4f4 * auVar19._4_4_ * 3.0;
    auVar15._4_4_ = fStack_134;
    auVar15._0_4_ = local_138;
    fStack_130 = fStack_4f0 * auVar19._8_4_ * 3.0;
    auVar15._8_4_ = fStack_130;
    fStack_12c = fStack_4ec * auVar19._12_4_ * 3.0;
    auVar15._12_4_ = fStack_12c;
    fStack_128 = local_4f8 * auVar19._16_4_ * 3.0;
    auVar15._16_4_ = fStack_128;
    fStack_124 = fStack_4f4 * auVar19._20_4_ * 3.0;
    auVar15._20_4_ = fStack_124;
    fStack_120 = fStack_4f0 * auVar19._24_4_ * 3.0;
    auVar15._24_4_ = fStack_120;
    auVar15._28_4_ = auVar19._28_4_;
    local_158 = local_4f8 * auVar17._0_4_ * 3.0;
    fStack_154 = fStack_4f4 * auVar17._4_4_ * 3.0;
    auVar20._4_4_ = fStack_154;
    auVar20._0_4_ = local_158;
    fStack_150 = fStack_4f0 * auVar17._8_4_ * 3.0;
    auVar20._8_4_ = fStack_150;
    fStack_14c = fStack_4ec * auVar17._12_4_ * 3.0;
    auVar20._12_4_ = fStack_14c;
    fStack_148 = local_4f8 * auVar17._16_4_ * 3.0;
    auVar20._16_4_ = fStack_148;
    fStack_144 = fStack_4f4 * auVar17._20_4_ * 3.0;
    auVar20._20_4_ = fStack_144;
    fStack_140 = fStack_4f0 * auVar17._24_4_ * 3.0;
    auVar20._24_4_ = fStack_140;
    auVar20._28_4_ = auVar241._28_4_;
    auVar17 = vperm2f128_avx(auVar269,auVar269,1);
    auVar17 = vshufps_avx(auVar17,auVar269,0x30);
    auVar105 = vshufps_avx(auVar269,auVar17,0x29);
    auVar15 = vsubps_avx(auVar269,auVar15);
    auVar17 = vperm2f128_avx(auVar15,auVar15,1);
    auVar17 = vshufps_avx(auVar17,auVar15,0x30);
    auVar17 = vshufps_avx(auVar15,auVar17,0x29);
    auVar20 = vsubps_avx(auVar298,auVar20);
    auVar15 = vperm2f128_avx(auVar20,auVar20,1);
    auVar15 = vshufps_avx(auVar15,auVar20,0x30);
    auVar20 = vshufps_avx(auVar20,auVar15,0x29);
    auVar21 = vsubps_avx(auVar269,local_b8);
    auVar106 = vsubps_avx(auVar105,auVar104);
    fVar109 = auVar106._0_4_ + auVar21._0_4_;
    fVar111 = auVar106._4_4_ + auVar21._4_4_;
    fVar179 = auVar106._8_4_ + auVar21._8_4_;
    fVar193 = auVar106._12_4_ + auVar21._12_4_;
    fVar195 = auVar106._16_4_ + auVar21._16_4_;
    fVar197 = auVar106._20_4_ + auVar21._20_4_;
    fVar200 = auVar106._24_4_ + auVar21._24_4_;
    auVar15 = vperm2f128_avx(auVar192,auVar192,1);
    auVar15 = vshufps_avx(auVar15,auVar192,0x30);
    local_d8 = vshufps_avx(auVar192,auVar15,0x29);
    auVar15 = vperm2f128_avx(auVar298,auVar298,1);
    auVar15 = vshufps_avx(auVar15,auVar298,0x30);
    local_98 = vshufps_avx(auVar298,auVar15,0x29);
    auVar15 = vsubps_avx(auVar298,auVar192);
    auVar144 = vsubps_avx(local_98,local_d8);
    fVar223 = auVar144._0_4_ + auVar15._0_4_;
    fVar225 = auVar144._4_4_ + auVar15._4_4_;
    fVar228 = auVar144._8_4_ + auVar15._8_4_;
    fVar224 = auVar144._12_4_ + auVar15._12_4_;
    fVar226 = auVar144._16_4_ + auVar15._16_4_;
    fVar229 = auVar144._20_4_ + auVar15._20_4_;
    fVar112 = auVar144._24_4_ + auVar15._24_4_;
    auVar22._4_4_ = fVar111 * auVar192._4_4_;
    auVar22._0_4_ = fVar109 * auVar192._0_4_;
    auVar22._8_4_ = fVar179 * auVar192._8_4_;
    auVar22._12_4_ = fVar193 * auVar192._12_4_;
    auVar22._16_4_ = fVar195 * auVar192._16_4_;
    auVar22._20_4_ = fVar197 * auVar192._20_4_;
    auVar22._24_4_ = fVar200 * auVar192._24_4_;
    auVar22._28_4_ = auVar15._28_4_;
    auVar23._4_4_ = fVar225 * local_b8._4_4_;
    auVar23._0_4_ = fVar223 * local_b8._0_4_;
    auVar23._8_4_ = fVar228 * local_b8._8_4_;
    auVar23._12_4_ = fVar224 * local_b8._12_4_;
    auVar23._16_4_ = fVar226 * local_b8._16_4_;
    auVar23._20_4_ = fVar229 * local_b8._20_4_;
    auVar23._24_4_ = fVar112 * local_b8._24_4_;
    auVar23._28_4_ = fVar335;
    auVar22 = vsubps_avx(auVar22,auVar23);
    local_f8 = local_b8._0_4_ + local_f8;
    fStack_f4 = local_b8._4_4_ + fStack_f4;
    fStack_f0 = local_b8._8_4_ + fStack_f0;
    fStack_ec = local_b8._12_4_ + fStack_ec;
    fStack_e8 = local_b8._16_4_ + fStack_e8;
    fStack_e4 = local_b8._20_4_ + fStack_e4;
    fStack_e0 = local_b8._24_4_ + fStack_e0;
    fStack_dc = local_b8._28_4_ + auVar16._28_4_;
    local_118 = local_118 + auVar192._0_4_;
    fStack_114 = fStack_114 + auVar192._4_4_;
    fStack_110 = fStack_110 + auVar192._8_4_;
    fStack_10c = fStack_10c + auVar192._12_4_;
    fStack_108 = fStack_108 + auVar192._16_4_;
    fStack_104 = fStack_104 + auVar192._20_4_;
    fStack_100 = fStack_100 + auVar192._24_4_;
    fStack_fc = fVar338 + auVar192._28_4_;
    auVar16._4_4_ = fVar111 * fStack_114;
    auVar16._0_4_ = fVar109 * local_118;
    auVar16._8_4_ = fVar179 * fStack_110;
    auVar16._12_4_ = fVar193 * fStack_10c;
    auVar16._16_4_ = fVar195 * fStack_108;
    auVar16._20_4_ = fVar197 * fStack_104;
    auVar16._24_4_ = fVar200 * fStack_100;
    auVar16._28_4_ = fVar338;
    auVar24._4_4_ = fVar225 * fStack_f4;
    auVar24._0_4_ = fVar223 * local_f8;
    auVar24._8_4_ = fVar228 * fStack_f0;
    auVar24._12_4_ = fVar224 * fStack_ec;
    auVar24._16_4_ = fVar226 * fStack_e8;
    auVar24._20_4_ = fVar229 * fStack_e4;
    auVar24._24_4_ = fVar112 * fStack_e0;
    auVar24._28_4_ = fVar338 + auVar192._28_4_;
    auVar16 = vsubps_avx(auVar16,auVar24);
    local_4d8 = auVar18._0_4_;
    fStack_4d4 = auVar18._4_4_;
    fStack_4d0 = auVar18._8_4_;
    fStack_4cc = auVar18._12_4_;
    fStack_4c8 = auVar18._16_4_;
    fStack_4c4 = auVar18._20_4_;
    fStack_4c0 = auVar18._24_4_;
    auVar25._4_4_ = fVar111 * fStack_4d4;
    auVar25._0_4_ = fVar109 * local_4d8;
    auVar25._8_4_ = fVar179 * fStack_4d0;
    auVar25._12_4_ = fVar193 * fStack_4cc;
    auVar25._16_4_ = fVar195 * fStack_4c8;
    auVar25._20_4_ = fVar197 * fStack_4c4;
    auVar25._24_4_ = fVar200 * fStack_4c0;
    auVar25._28_4_ = fVar338;
    local_518 = auVar103._0_4_;
    fStack_514 = auVar103._4_4_;
    fStack_510 = auVar103._8_4_;
    fStack_50c = auVar103._12_4_;
    fStack_508 = auVar103._16_4_;
    fStack_504 = auVar103._20_4_;
    fStack_500 = auVar103._24_4_;
    auVar26._4_4_ = fVar225 * fStack_514;
    auVar26._0_4_ = fVar223 * local_518;
    auVar26._8_4_ = fVar228 * fStack_510;
    auVar26._12_4_ = fVar224 * fStack_50c;
    auVar26._16_4_ = fVar226 * fStack_508;
    auVar26._20_4_ = fVar229 * fStack_504;
    auVar26._24_4_ = fVar112 * fStack_500;
    auVar26._28_4_ = local_b8._28_4_;
    auVar23 = vsubps_avx(auVar25,auVar26);
    auVar27._4_4_ = local_d8._4_4_ * fVar111;
    auVar27._0_4_ = local_d8._0_4_ * fVar109;
    auVar27._8_4_ = local_d8._8_4_ * fVar179;
    auVar27._12_4_ = local_d8._12_4_ * fVar193;
    auVar27._16_4_ = local_d8._16_4_ * fVar195;
    auVar27._20_4_ = local_d8._20_4_ * fVar197;
    auVar27._24_4_ = local_d8._24_4_ * fVar200;
    auVar27._28_4_ = fVar338;
    auVar28._4_4_ = auVar104._4_4_ * fVar225;
    auVar28._0_4_ = auVar104._0_4_ * fVar223;
    auVar28._8_4_ = auVar104._8_4_ * fVar228;
    auVar28._12_4_ = auVar104._12_4_ * fVar224;
    auVar28._16_4_ = auVar104._16_4_ * fVar226;
    auVar28._20_4_ = auVar104._20_4_ * fVar229;
    auVar28._24_4_ = auVar104._24_4_ * fVar112;
    auVar28._28_4_ = local_d8._28_4_;
    local_4f8 = auVar17._0_4_;
    fStack_4f4 = auVar17._4_4_;
    fStack_4f0 = auVar17._8_4_;
    fStack_4ec = auVar17._12_4_;
    fStack_4e8 = auVar17._16_4_;
    fStack_4e4 = auVar17._20_4_;
    fStack_4e0 = auVar17._24_4_;
    auVar24 = vsubps_avx(auVar27,auVar28);
    auVar29._4_4_ = auVar298._4_4_ * fVar111;
    auVar29._0_4_ = auVar298._0_4_ * fVar109;
    auVar29._8_4_ = auVar298._8_4_ * fVar179;
    auVar29._12_4_ = auVar298._12_4_ * fVar193;
    auVar29._16_4_ = auVar298._16_4_ * fVar195;
    auVar29._20_4_ = auVar298._20_4_ * fVar197;
    auVar29._24_4_ = auVar298._24_4_ * fVar200;
    auVar29._28_4_ = fVar338;
    auVar30._4_4_ = fVar225 * auVar269._4_4_;
    auVar30._0_4_ = fVar223 * auVar269._0_4_;
    auVar30._8_4_ = fVar228 * auVar269._8_4_;
    auVar30._12_4_ = fVar224 * auVar269._12_4_;
    auVar30._16_4_ = fVar226 * auVar269._16_4_;
    auVar30._20_4_ = fVar229 * auVar269._20_4_;
    auVar30._24_4_ = fVar112 * auVar269._24_4_;
    auVar30._28_4_ = fStack_dc;
    auVar25 = vsubps_avx(auVar29,auVar30);
    local_138 = auVar269._0_4_ + local_138;
    fStack_134 = auVar269._4_4_ + fStack_134;
    fStack_130 = auVar269._8_4_ + fStack_130;
    fStack_12c = auVar269._12_4_ + fStack_12c;
    fStack_128 = auVar269._16_4_ + fStack_128;
    fStack_124 = auVar269._20_4_ + fStack_124;
    fStack_120 = auVar269._24_4_ + fStack_120;
    fStack_11c = auVar269._28_4_ + auVar19._28_4_;
    local_158 = auVar298._0_4_ + local_158;
    fStack_154 = auVar298._4_4_ + fStack_154;
    fStack_150 = auVar298._8_4_ + fStack_150;
    fStack_14c = auVar298._12_4_ + fStack_14c;
    fStack_148 = auVar298._16_4_ + fStack_148;
    fStack_144 = auVar298._20_4_ + fStack_144;
    fStack_140 = auVar298._24_4_ + fStack_140;
    fStack_13c = auVar298._28_4_ + auVar241._28_4_;
    auVar19._4_4_ = fVar111 * fStack_154;
    auVar19._0_4_ = fVar109 * local_158;
    auVar19._8_4_ = fVar179 * fStack_150;
    auVar19._12_4_ = fVar193 * fStack_14c;
    auVar19._16_4_ = fVar195 * fStack_148;
    auVar19._20_4_ = fVar197 * fStack_144;
    auVar19._24_4_ = fVar200 * fStack_140;
    auVar19._28_4_ = auVar298._28_4_ + auVar241._28_4_;
    auVar31._4_4_ = fStack_134 * fVar225;
    auVar31._0_4_ = local_138 * fVar223;
    auVar31._8_4_ = fStack_130 * fVar228;
    auVar31._12_4_ = fStack_12c * fVar224;
    auVar31._16_4_ = fStack_128 * fVar226;
    auVar31._20_4_ = fStack_124 * fVar229;
    auVar31._24_4_ = fStack_120 * fVar112;
    auVar31._28_4_ = fStack_11c;
    auVar19 = vsubps_avx(auVar19,auVar31);
    auVar32._4_4_ = fVar111 * auVar20._4_4_;
    auVar32._0_4_ = fVar109 * auVar20._0_4_;
    auVar32._8_4_ = fVar179 * auVar20._8_4_;
    auVar32._12_4_ = fVar193 * auVar20._12_4_;
    auVar32._16_4_ = fVar195 * auVar20._16_4_;
    auVar32._20_4_ = fVar197 * auVar20._20_4_;
    auVar32._24_4_ = fVar200 * auVar20._24_4_;
    auVar32._28_4_ = fStack_11c;
    auVar33._4_4_ = fVar225 * fStack_4f4;
    auVar33._0_4_ = fVar223 * local_4f8;
    auVar33._8_4_ = fVar228 * fStack_4f0;
    auVar33._12_4_ = fVar224 * fStack_4ec;
    auVar33._16_4_ = fVar226 * fStack_4e8;
    auVar33._20_4_ = fVar229 * fStack_4e4;
    auVar33._24_4_ = fVar112 * fStack_4e0;
    auVar33._28_4_ = auVar20._28_4_;
    auVar26 = vsubps_avx(auVar32,auVar33);
    auVar34._4_4_ = fVar111 * local_98._4_4_;
    auVar34._0_4_ = fVar109 * local_98._0_4_;
    auVar34._8_4_ = fVar179 * local_98._8_4_;
    auVar34._12_4_ = fVar193 * local_98._12_4_;
    auVar34._16_4_ = fVar195 * local_98._16_4_;
    auVar34._20_4_ = fVar197 * local_98._20_4_;
    auVar34._24_4_ = fVar200 * local_98._24_4_;
    auVar34._28_4_ = auVar106._28_4_ + auVar21._28_4_;
    auVar21._4_4_ = auVar105._4_4_ * fVar225;
    auVar21._0_4_ = auVar105._0_4_ * fVar223;
    auVar21._8_4_ = auVar105._8_4_ * fVar228;
    auVar21._12_4_ = auVar105._12_4_ * fVar224;
    auVar21._16_4_ = auVar105._16_4_ * fVar226;
    auVar21._20_4_ = auVar105._20_4_ * fVar229;
    auVar21._24_4_ = auVar105._24_4_ * fVar112;
    auVar21._28_4_ = auVar144._28_4_ + auVar15._28_4_;
    auVar21 = vsubps_avx(auVar34,auVar21);
    auVar17 = vminps_avx(auVar22,auVar16);
    auVar103 = vmaxps_avx(auVar22,auVar16);
    auVar18 = vminps_avx(auVar23,auVar24);
    auVar18 = vminps_avx(auVar17,auVar18);
    auVar17 = vmaxps_avx(auVar23,auVar24);
    auVar103 = vmaxps_avx(auVar103,auVar17);
    auVar15 = vminps_avx(auVar25,auVar19);
    auVar17 = vmaxps_avx(auVar25,auVar19);
    auVar16 = vminps_avx(auVar26,auVar21);
    auVar16 = vminps_avx(auVar15,auVar16);
    auVar16 = vminps_avx(auVar18,auVar16);
    auVar18 = vmaxps_avx(auVar26,auVar21);
    auVar17 = vmaxps_avx(auVar17,auVar18);
    auVar17 = vmaxps_avx(auVar103,auVar17);
    auVar103 = vcmpps_avx(auVar16,local_78,2);
    auVar17 = vcmpps_avx(auVar17,local_248,5);
    auVar103 = vandps_avx(auVar17,auVar103);
    auVar17 = local_178 & auVar103;
    if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar17 >> 0x7f,0) != '\0') ||
          (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar17 >> 0xbf,0) != '\0') ||
        (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar17[0x1f] < '\0')
    {
      auVar17 = vsubps_avx(auVar104,local_b8);
      auVar18 = vsubps_avx(auVar105,auVar269);
      fVar111 = auVar17._0_4_ + auVar18._0_4_;
      fVar179 = auVar17._4_4_ + auVar18._4_4_;
      fVar193 = auVar17._8_4_ + auVar18._8_4_;
      fVar195 = auVar17._12_4_ + auVar18._12_4_;
      fVar197 = auVar17._16_4_ + auVar18._16_4_;
      fVar200 = auVar17._20_4_ + auVar18._20_4_;
      fVar223 = auVar17._24_4_ + auVar18._24_4_;
      auVar16 = vsubps_avx(local_d8,auVar192);
      auVar19 = vsubps_avx(local_98,auVar298);
      fVar225 = auVar16._0_4_ + auVar19._0_4_;
      fVar228 = auVar16._4_4_ + auVar19._4_4_;
      fVar224 = auVar16._8_4_ + auVar19._8_4_;
      fVar226 = auVar16._12_4_ + auVar19._12_4_;
      fVar229 = auVar16._16_4_ + auVar19._16_4_;
      fVar112 = auVar16._20_4_ + auVar19._20_4_;
      fVar113 = auVar16._24_4_ + auVar19._24_4_;
      fVar109 = auVar19._28_4_;
      auVar35._4_4_ = auVar192._4_4_ * fVar179;
      auVar35._0_4_ = auVar192._0_4_ * fVar111;
      auVar35._8_4_ = auVar192._8_4_ * fVar193;
      auVar35._12_4_ = auVar192._12_4_ * fVar195;
      auVar35._16_4_ = auVar192._16_4_ * fVar197;
      auVar35._20_4_ = auVar192._20_4_ * fVar200;
      auVar35._24_4_ = auVar192._24_4_ * fVar223;
      auVar35._28_4_ = auVar192._28_4_;
      auVar36._4_4_ = local_b8._4_4_ * fVar228;
      auVar36._0_4_ = local_b8._0_4_ * fVar225;
      auVar36._8_4_ = local_b8._8_4_ * fVar224;
      auVar36._12_4_ = local_b8._12_4_ * fVar226;
      auVar36._16_4_ = local_b8._16_4_ * fVar229;
      auVar36._20_4_ = local_b8._20_4_ * fVar112;
      auVar36._24_4_ = local_b8._24_4_ * fVar113;
      auVar36._28_4_ = local_b8._28_4_;
      auVar19 = vsubps_avx(auVar35,auVar36);
      auVar37._4_4_ = fVar179 * fStack_114;
      auVar37._0_4_ = fVar111 * local_118;
      auVar37._8_4_ = fVar193 * fStack_110;
      auVar37._12_4_ = fVar195 * fStack_10c;
      auVar37._16_4_ = fVar197 * fStack_108;
      auVar37._20_4_ = fVar200 * fStack_104;
      auVar37._24_4_ = fVar223 * fStack_100;
      auVar37._28_4_ = auVar192._28_4_;
      auVar38._4_4_ = fVar228 * fStack_f4;
      auVar38._0_4_ = fVar225 * local_f8;
      auVar38._8_4_ = fVar224 * fStack_f0;
      auVar38._12_4_ = fVar226 * fStack_ec;
      auVar38._16_4_ = fVar229 * fStack_e8;
      auVar38._20_4_ = fVar112 * fStack_e4;
      auVar38._24_4_ = fVar113 * fStack_e0;
      auVar38._28_4_ = fVar109;
      auVar21 = vsubps_avx(auVar37,auVar38);
      auVar39._4_4_ = fVar179 * fStack_4d4;
      auVar39._0_4_ = fVar111 * local_4d8;
      auVar39._8_4_ = fVar193 * fStack_4d0;
      auVar39._12_4_ = fVar195 * fStack_4cc;
      auVar39._16_4_ = fVar197 * fStack_4c8;
      auVar39._20_4_ = fVar200 * fStack_4c4;
      auVar39._24_4_ = fVar223 * fStack_4c0;
      auVar39._28_4_ = fVar109;
      auVar40._4_4_ = fVar228 * fStack_514;
      auVar40._0_4_ = fVar225 * local_518;
      auVar40._8_4_ = fVar224 * fStack_510;
      auVar40._12_4_ = fVar226 * fStack_50c;
      auVar40._16_4_ = fVar229 * fStack_508;
      auVar40._20_4_ = fVar112 * fStack_504;
      auVar40._24_4_ = fVar113 * fStack_500;
      auVar40._28_4_ = auVar15._28_4_;
      auVar106 = vsubps_avx(auVar39,auVar40);
      auVar41._4_4_ = local_d8._4_4_ * fVar179;
      auVar41._0_4_ = local_d8._0_4_ * fVar111;
      auVar41._8_4_ = local_d8._8_4_ * fVar193;
      auVar41._12_4_ = local_d8._12_4_ * fVar195;
      auVar41._16_4_ = local_d8._16_4_ * fVar197;
      auVar41._20_4_ = local_d8._20_4_ * fVar200;
      auVar41._24_4_ = local_d8._24_4_ * fVar223;
      auVar41._28_4_ = auVar15._28_4_;
      auVar42._4_4_ = auVar104._4_4_ * fVar228;
      auVar42._0_4_ = auVar104._0_4_ * fVar225;
      auVar42._8_4_ = auVar104._8_4_ * fVar224;
      auVar42._12_4_ = auVar104._12_4_ * fVar226;
      auVar42._16_4_ = auVar104._16_4_ * fVar229;
      auVar42._20_4_ = auVar104._20_4_ * fVar112;
      uVar4 = auVar104._28_4_;
      auVar42._24_4_ = auVar104._24_4_ * fVar113;
      auVar42._28_4_ = uVar4;
      auVar104 = vsubps_avx(auVar41,auVar42);
      auVar43._4_4_ = auVar298._4_4_ * fVar179;
      auVar43._0_4_ = auVar298._0_4_ * fVar111;
      auVar43._8_4_ = auVar298._8_4_ * fVar193;
      auVar43._12_4_ = auVar298._12_4_ * fVar195;
      auVar43._16_4_ = auVar298._16_4_ * fVar197;
      auVar43._20_4_ = auVar298._20_4_ * fVar200;
      auVar43._24_4_ = auVar298._24_4_ * fVar223;
      auVar43._28_4_ = uVar4;
      auVar44._4_4_ = auVar269._4_4_ * fVar228;
      auVar44._0_4_ = auVar269._0_4_ * fVar225;
      auVar44._8_4_ = auVar269._8_4_ * fVar224;
      auVar44._12_4_ = auVar269._12_4_ * fVar226;
      auVar44._16_4_ = auVar269._16_4_ * fVar229;
      auVar44._20_4_ = auVar269._20_4_ * fVar112;
      auVar44._24_4_ = auVar269._24_4_ * fVar113;
      auVar44._28_4_ = auVar269._28_4_;
      auVar144 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = fVar179 * fStack_154;
      auVar45._0_4_ = fVar111 * local_158;
      auVar45._8_4_ = fVar193 * fStack_150;
      auVar45._12_4_ = fVar195 * fStack_14c;
      auVar45._16_4_ = fVar197 * fStack_148;
      auVar45._20_4_ = fVar200 * fStack_144;
      auVar45._24_4_ = fVar223 * fStack_140;
      auVar45._28_4_ = uVar4;
      auVar46._4_4_ = fVar228 * fStack_134;
      auVar46._0_4_ = fVar225 * local_138;
      auVar46._8_4_ = fVar224 * fStack_130;
      auVar46._12_4_ = fVar226 * fStack_12c;
      auVar46._16_4_ = fVar229 * fStack_128;
      auVar46._20_4_ = fVar112 * fStack_124;
      auVar46._24_4_ = fVar113 * fStack_120;
      auVar46._28_4_ = auVar298._28_4_;
      auVar22 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = fVar179 * auVar20._4_4_;
      auVar47._0_4_ = fVar111 * auVar20._0_4_;
      auVar47._8_4_ = fVar193 * auVar20._8_4_;
      auVar47._12_4_ = fVar195 * auVar20._12_4_;
      auVar47._16_4_ = fVar197 * auVar20._16_4_;
      auVar47._20_4_ = fVar200 * auVar20._20_4_;
      auVar47._24_4_ = fVar223 * auVar20._24_4_;
      auVar47._28_4_ = auVar298._28_4_;
      auVar48._4_4_ = fStack_4f4 * fVar228;
      auVar48._0_4_ = local_4f8 * fVar225;
      auVar48._8_4_ = fStack_4f0 * fVar224;
      auVar48._12_4_ = fStack_4ec * fVar226;
      auVar48._16_4_ = fStack_4e8 * fVar229;
      auVar48._20_4_ = fStack_4e4 * fVar112;
      auVar48._24_4_ = fStack_4e0 * fVar113;
      auVar48._28_4_ = local_d8._28_4_;
      auVar20 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = local_98._4_4_ * fVar179;
      auVar49._0_4_ = local_98._0_4_ * fVar111;
      auVar49._8_4_ = local_98._8_4_ * fVar193;
      auVar49._12_4_ = local_98._12_4_ * fVar195;
      auVar49._16_4_ = local_98._16_4_ * fVar197;
      auVar49._20_4_ = local_98._20_4_ * fVar200;
      auVar49._24_4_ = local_98._24_4_ * fVar223;
      auVar49._28_4_ = auVar17._28_4_ + auVar18._28_4_;
      auVar50._4_4_ = auVar105._4_4_ * fVar228;
      auVar50._0_4_ = auVar105._0_4_ * fVar225;
      auVar50._8_4_ = auVar105._8_4_ * fVar224;
      auVar50._12_4_ = auVar105._12_4_ * fVar226;
      auVar50._16_4_ = auVar105._16_4_ * fVar229;
      auVar50._20_4_ = auVar105._20_4_ * fVar112;
      auVar50._24_4_ = auVar105._24_4_ * fVar113;
      auVar50._28_4_ = auVar16._28_4_ + fVar109;
      auVar105 = vsubps_avx(auVar49,auVar50);
      auVar18 = vminps_avx(auVar19,auVar21);
      auVar17 = vmaxps_avx(auVar19,auVar21);
      auVar15 = vminps_avx(auVar106,auVar104);
      auVar15 = vminps_avx(auVar18,auVar15);
      auVar18 = vmaxps_avx(auVar106,auVar104);
      auVar17 = vmaxps_avx(auVar17,auVar18);
      auVar16 = vminps_avx(auVar144,auVar22);
      auVar18 = vmaxps_avx(auVar144,auVar22);
      auVar104 = vminps_avx(auVar20,auVar105);
      auVar16 = vminps_avx(auVar16,auVar104);
      auVar16 = vminps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(auVar20,auVar105);
      auVar18 = vmaxps_avx(auVar18,auVar15);
      auVar18 = vmaxps_avx(auVar17,auVar18);
      auVar17 = vcmpps_avx(auVar16,local_78,2);
      auVar18 = vcmpps_avx(auVar18,local_248,5);
      auVar17 = vandps_avx(auVar18,auVar17);
      auVar103 = vandps_avx(local_178,auVar103);
      auVar18 = auVar103 & auVar17;
      if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar18 >> 0x7f,0) != '\0') ||
            (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0xbf,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar18[0x1f] < '\0') {
        auVar103 = vandps_avx(auVar17,auVar103);
        uVar67 = vmovmskps_avx(auVar103);
        if (uVar67 != 0) {
          uVar65 = (ulong)uVar69;
          auStack_388[uVar65] = uVar67 & 0xff;
          uVar5 = vmovlps_avx(local_308);
          *(undefined8 *)(afStack_228 + uVar65 * 2) = uVar5;
          uVar63 = vmovlps_avx(auVar73);
          auStack_58[uVar65] = uVar63;
          uVar69 = uVar69 + 1;
        }
      }
    }
    if (uVar69 != 0) {
      do {
        uVar65 = (ulong)(uVar69 - 1);
        uVar67 = auStack_388[uVar65];
        fVar109 = afStack_228[uVar65 * 2];
        fVar111 = afStack_228[uVar65 * 2 + 1];
        auVar346._8_8_ = 0;
        auVar346._0_8_ = auStack_58[uVar65];
        auVar350 = ZEXT1664(auVar346);
        uVar63 = 0;
        if (uVar67 != 0) {
          for (; (uVar67 >> uVar63 & 1) == 0; uVar63 = uVar63 + 1) {
          }
        }
        uVar67 = uVar67 - 1 & uVar67;
        auStack_388[uVar65] = uVar67;
        if (uVar67 == 0) {
          uVar69 = uVar69 - 1;
        }
        fVar193 = (float)(uVar63 + 1) * 0.14285715;
        fVar179 = (1.0 - (float)uVar63 * 0.14285715) * fVar109 +
                  fVar111 * (float)uVar63 * 0.14285715;
        fVar109 = (1.0 - fVar193) * fVar109 + fVar111 * fVar193;
        fVar111 = fVar109 - fVar179;
        if (0.16666667 <= fVar111) {
          auVar90 = vinsertps_avx(ZEXT416((uint)fVar179),ZEXT416((uint)fVar109),0x10);
          auVar354 = ZEXT1664(auVar90);
          goto LAB_00fb7111;
        }
        auVar90 = vshufps_avx(auVar346,auVar346,0x50);
        auVar126._8_4_ = 0x3f800000;
        auVar126._0_8_ = 0x3f8000003f800000;
        auVar126._12_4_ = 0x3f800000;
        auVar310 = vsubps_avx(auVar126,auVar90);
        fVar193 = auVar90._0_4_;
        fVar195 = auVar90._4_4_;
        fVar197 = auVar90._8_4_;
        fVar200 = auVar90._12_4_;
        fVar223 = auVar310._0_4_;
        fVar225 = auVar310._4_4_;
        fVar228 = auVar310._8_4_;
        fVar224 = auVar310._12_4_;
        auVar160._0_4_ = fVar193 * auVar329._0_4_ + fVar223 * fVar243;
        auVar160._4_4_ = fVar195 * auVar329._4_4_ + fVar225 * fVar180;
        auVar160._8_4_ = fVar197 * auVar329._0_4_ + fVar228 * fVar243;
        auVar160._12_4_ = fVar200 * auVar329._4_4_ + fVar224 * fVar180;
        auVar211._0_4_ = auVar293._0_4_ * fVar193 + fVar223 * auVar125._0_4_;
        auVar211._4_4_ = auVar293._4_4_ * fVar195 + fVar225 * auVar125._4_4_;
        auVar211._8_4_ = auVar293._0_4_ * fVar197 + fVar228 * auVar125._0_4_;
        auVar211._12_4_ = auVar293._4_4_ * fVar200 + fVar224 * auVar125._4_4_;
        auVar234._0_4_ = auVar312._0_4_ * fVar193 + auVar341._0_4_ * fVar223;
        auVar234._4_4_ = auVar312._4_4_ * fVar195 + auVar341._4_4_ * fVar225;
        auVar234._8_4_ = auVar312._0_4_ * fVar197 + auVar341._0_4_ * fVar228;
        auVar234._12_4_ = auVar312._4_4_ * fVar200 + auVar341._4_4_ * fVar224;
        auVar87._0_4_ = auVar85._0_4_ * fVar193 + auVar265._0_4_ * fVar223;
        auVar87._4_4_ = auVar85._4_4_ * fVar195 + auVar265._4_4_ * fVar225;
        auVar87._8_4_ = auVar85._0_4_ * fVar197 + auVar265._0_4_ * fVar228;
        auVar87._12_4_ = auVar85._4_4_ * fVar200 + auVar265._4_4_ * fVar224;
        auVar145._16_16_ = auVar160;
        auVar145._0_16_ = auVar160;
        auVar177._16_16_ = auVar211;
        auVar177._0_16_ = auVar211;
        auVar222._16_16_ = auVar234;
        auVar222._0_16_ = auVar234;
        auVar103 = ZEXT2032(CONCAT416(fVar109,ZEXT416((uint)fVar179)));
        auVar103 = vshufps_avx(auVar103,auVar103,0);
        auVar17 = vsubps_avx(auVar177,auVar145);
        fVar193 = auVar103._0_4_;
        fVar195 = auVar103._4_4_;
        fVar197 = auVar103._8_4_;
        fVar200 = auVar103._12_4_;
        fVar223 = auVar103._16_4_;
        fVar225 = auVar103._20_4_;
        fVar228 = auVar103._24_4_;
        auVar146._0_4_ = auVar160._0_4_ + auVar17._0_4_ * fVar193;
        auVar146._4_4_ = auVar160._4_4_ + auVar17._4_4_ * fVar195;
        auVar146._8_4_ = auVar160._8_4_ + auVar17._8_4_ * fVar197;
        auVar146._12_4_ = auVar160._12_4_ + auVar17._12_4_ * fVar200;
        auVar146._16_4_ = auVar160._0_4_ + auVar17._16_4_ * fVar223;
        auVar146._20_4_ = auVar160._4_4_ + auVar17._20_4_ * fVar225;
        auVar146._24_4_ = auVar160._8_4_ + auVar17._24_4_ * fVar228;
        auVar146._28_4_ = auVar160._12_4_ + auVar17._28_4_;
        auVar103 = vsubps_avx(auVar222,auVar177);
        auVar178._0_4_ = auVar211._0_4_ + auVar103._0_4_ * fVar193;
        auVar178._4_4_ = auVar211._4_4_ + auVar103._4_4_ * fVar195;
        auVar178._8_4_ = auVar211._8_4_ + auVar103._8_4_ * fVar197;
        auVar178._12_4_ = auVar211._12_4_ + auVar103._12_4_ * fVar200;
        auVar178._16_4_ = auVar211._0_4_ + auVar103._16_4_ * fVar223;
        auVar178._20_4_ = auVar211._4_4_ + auVar103._20_4_ * fVar225;
        auVar178._24_4_ = auVar211._8_4_ + auVar103._24_4_ * fVar228;
        auVar178._28_4_ = auVar211._12_4_ + auVar103._28_4_;
        auVar90 = vsubps_avx(auVar87,auVar234);
        auVar107._0_4_ = auVar234._0_4_ + auVar90._0_4_ * fVar193;
        auVar107._4_4_ = auVar234._4_4_ + auVar90._4_4_ * fVar195;
        auVar107._8_4_ = auVar234._8_4_ + auVar90._8_4_ * fVar197;
        auVar107._12_4_ = auVar234._12_4_ + auVar90._12_4_ * fVar200;
        auVar107._16_4_ = auVar234._0_4_ + auVar90._0_4_ * fVar223;
        auVar107._20_4_ = auVar234._4_4_ + auVar90._4_4_ * fVar225;
        auVar107._24_4_ = auVar234._8_4_ + auVar90._8_4_ * fVar228;
        auVar107._28_4_ = auVar234._12_4_ + auVar90._12_4_;
        auVar103 = vsubps_avx(auVar178,auVar146);
        auVar147._0_4_ = auVar146._0_4_ + fVar193 * auVar103._0_4_;
        auVar147._4_4_ = auVar146._4_4_ + fVar195 * auVar103._4_4_;
        auVar147._8_4_ = auVar146._8_4_ + fVar197 * auVar103._8_4_;
        auVar147._12_4_ = auVar146._12_4_ + fVar200 * auVar103._12_4_;
        auVar147._16_4_ = auVar146._16_4_ + fVar223 * auVar103._16_4_;
        auVar147._20_4_ = auVar146._20_4_ + fVar225 * auVar103._20_4_;
        auVar147._24_4_ = auVar146._24_4_ + fVar228 * auVar103._24_4_;
        auVar147._28_4_ = auVar146._28_4_ + auVar103._28_4_;
        auVar103 = vsubps_avx(auVar107,auVar178);
        auVar108._0_4_ = auVar178._0_4_ + fVar193 * auVar103._0_4_;
        auVar108._4_4_ = auVar178._4_4_ + fVar195 * auVar103._4_4_;
        auVar108._8_4_ = auVar178._8_4_ + fVar197 * auVar103._8_4_;
        auVar108._12_4_ = auVar178._12_4_ + fVar200 * auVar103._12_4_;
        auVar108._16_4_ = auVar178._16_4_ + fVar223 * auVar103._16_4_;
        auVar108._20_4_ = auVar178._20_4_ + fVar225 * auVar103._20_4_;
        auVar108._24_4_ = auVar178._24_4_ + fVar228 * auVar103._24_4_;
        auVar108._28_4_ = auVar178._28_4_ + auVar103._28_4_;
        auVar103 = vsubps_avx(auVar108,auVar147);
        auVar252._0_4_ = auVar147._0_4_ + fVar193 * auVar103._0_4_;
        auVar252._4_4_ = auVar147._4_4_ + fVar195 * auVar103._4_4_;
        auVar252._8_4_ = auVar147._8_4_ + fVar197 * auVar103._8_4_;
        auVar252._12_4_ = auVar147._12_4_ + fVar200 * auVar103._12_4_;
        auVar257._16_4_ = auVar147._16_4_ + fVar223 * auVar103._16_4_;
        auVar257._0_16_ = auVar252;
        auVar257._20_4_ = auVar147._20_4_ + fVar225 * auVar103._20_4_;
        auVar257._24_4_ = auVar147._24_4_ + fVar228 * auVar103._24_4_;
        auVar257._28_4_ = auVar147._28_4_ + auVar178._28_4_;
        auVar258 = auVar257._16_16_;
        auVar128 = vshufps_avx(ZEXT416((uint)(fVar111 * 0.33333334)),
                               ZEXT416((uint)(fVar111 * 0.33333334)),0);
        auVar212._0_4_ = auVar252._0_4_ + auVar128._0_4_ * auVar103._0_4_ * 3.0;
        auVar212._4_4_ = auVar252._4_4_ + auVar128._4_4_ * auVar103._4_4_ * 3.0;
        auVar212._8_4_ = auVar252._8_4_ + auVar128._8_4_ * auVar103._8_4_ * 3.0;
        auVar212._12_4_ = auVar252._12_4_ + auVar128._12_4_ * auVar103._12_4_ * 3.0;
        auVar176 = vshufpd_avx(auVar252,auVar252,3);
        auVar140 = vshufpd_avx(auVar258,auVar258,3);
        auVar90 = vsubps_avx(auVar176,auVar252);
        auVar310 = vsubps_avx(auVar140,auVar258);
        auVar88._0_4_ = auVar90._0_4_ + auVar310._0_4_;
        auVar88._4_4_ = auVar90._4_4_ + auVar310._4_4_;
        auVar88._8_4_ = auVar90._8_4_ + auVar310._8_4_;
        auVar88._12_4_ = auVar90._12_4_ + auVar310._12_4_;
        auVar90 = vmovshdup_avx(auVar252);
        auVar310 = vmovshdup_avx(auVar212);
        auVar162 = vshufps_avx(auVar88,auVar88,0);
        auVar129 = vshufps_avx(auVar88,auVar88,0x55);
        fVar193 = auVar129._0_4_;
        fVar195 = auVar129._4_4_;
        fVar197 = auVar129._8_4_;
        fVar200 = auVar129._12_4_;
        fVar223 = auVar162._0_4_;
        fVar225 = auVar162._4_4_;
        fVar228 = auVar162._8_4_;
        fVar224 = auVar162._12_4_;
        auVar89._0_4_ = fVar223 * auVar252._0_4_ + auVar90._0_4_ * fVar193;
        auVar89._4_4_ = fVar225 * auVar252._4_4_ + auVar90._4_4_ * fVar195;
        auVar89._8_4_ = fVar228 * auVar252._8_4_ + auVar90._8_4_ * fVar197;
        auVar89._12_4_ = fVar224 * auVar252._12_4_ + auVar90._12_4_ * fVar200;
        auVar319._0_4_ = fVar223 * auVar212._0_4_ + auVar310._0_4_ * fVar193;
        auVar319._4_4_ = fVar225 * auVar212._4_4_ + auVar310._4_4_ * fVar195;
        auVar319._8_4_ = fVar228 * auVar212._8_4_ + auVar310._8_4_ * fVar197;
        auVar319._12_4_ = fVar224 * auVar212._12_4_ + auVar310._12_4_ * fVar200;
        auVar310 = vshufps_avx(auVar89,auVar89,0xe8);
        auVar162 = vshufps_avx(auVar319,auVar319,0xe8);
        auVar90 = vcmpps_avx(auVar310,auVar162,1);
        uVar67 = vextractps_avx(auVar90,0);
        auVar129 = auVar319;
        if ((uVar67 & 1) == 0) {
          auVar129 = auVar89;
        }
        auVar127._0_4_ = auVar128._0_4_ * auVar103._16_4_ * 3.0;
        auVar127._4_4_ = auVar128._4_4_ * auVar103._20_4_ * 3.0;
        auVar127._8_4_ = auVar128._8_4_ * auVar103._24_4_ * 3.0;
        auVar127._12_4_ = auVar128._12_4_ * 0.0;
        auVar72 = vsubps_avx(auVar258,auVar127);
        auVar128 = vmovshdup_avx(auVar72);
        auVar258 = vmovshdup_avx(auVar258);
        fVar226 = auVar72._0_4_;
        fVar229 = auVar72._4_4_;
        auVar235._0_4_ = fVar226 * fVar223 + auVar128._0_4_ * fVar193;
        auVar235._4_4_ = fVar229 * fVar225 + auVar128._4_4_ * fVar195;
        auVar235._8_4_ = auVar72._8_4_ * fVar228 + auVar128._8_4_ * fVar197;
        auVar235._12_4_ = auVar72._12_4_ * fVar224 + auVar128._12_4_ * fVar200;
        auVar353._0_4_ = fVar223 * auVar257._16_4_ + auVar258._0_4_ * fVar193;
        auVar353._4_4_ = fVar225 * auVar257._20_4_ + auVar258._4_4_ * fVar195;
        auVar353._8_4_ = fVar228 * auVar257._24_4_ + auVar258._8_4_ * fVar197;
        auVar353._12_4_ = fVar224 * auVar257._28_4_ + auVar258._12_4_ * fVar200;
        auVar258 = vshufps_avx(auVar235,auVar235,0xe8);
        auVar71 = vshufps_avx(auVar353,auVar353,0xe8);
        auVar128 = vcmpps_avx(auVar258,auVar71,1);
        uVar67 = vextractps_avx(auVar128,0);
        auVar73 = auVar353;
        if ((uVar67 & 1) == 0) {
          auVar73 = auVar235;
        }
        auVar129 = vmaxss_avx(auVar73,auVar129);
        auVar310 = vminps_avx(auVar310,auVar162);
        auVar162 = vminps_avx(auVar258,auVar71);
        auVar162 = vminps_avx(auVar310,auVar162);
        auVar90 = vshufps_avx(auVar90,auVar90,0x55);
        auVar90 = vblendps_avx(auVar90,auVar128,2);
        auVar128 = vpslld_avx(auVar90,0x1f);
        auVar90 = vshufpd_avx(auVar319,auVar319,1);
        auVar90 = vinsertps_avx(auVar90,auVar353,0x9c);
        auVar310 = vshufpd_avx(auVar89,auVar89,1);
        auVar310 = vinsertps_avx(auVar310,auVar235,0x9c);
        auVar90 = vblendvps_avx(auVar310,auVar90,auVar128);
        auVar310 = vmovshdup_avx(auVar90);
        auVar90 = vmaxss_avx(auVar310,auVar90);
        fVar197 = auVar162._0_4_;
        auVar310 = vmovshdup_avx(auVar162);
        fVar195 = auVar90._0_4_;
        fVar200 = auVar310._0_4_;
        fVar193 = auVar129._0_4_;
        if ((0.0001 <= fVar197) || (fVar195 <= -0.0001)) {
          if ((fVar200 < 0.0001 && -0.0001 < fVar193) || (fVar197 < 0.0001 && -0.0001 < fVar193))
          goto LAB_00fb7b1a;
          auVar128 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar90,1);
          auVar310 = vcmpps_avx(auVar310,SUB6416(ZEXT464(0x38d1b717),0),1);
          auVar310 = vandps_avx(auVar310,auVar128);
          if ((auVar310 & (undefined1  [16])0x1) != (undefined1  [16])0x0) goto LAB_00fb7b1a;
        }
        else {
LAB_00fb7b1a:
          auVar128 = vcmpps_avx(auVar162,_DAT_01f7aa10,1);
          auVar310 = vcmpss_avx(auVar129,ZEXT416(0) << 0x20,1);
          auVar161._8_4_ = 0x3f800000;
          auVar161._0_8_ = 0x3f8000003f800000;
          auVar161._12_4_ = 0x3f800000;
          auVar213._8_4_ = 0xbf800000;
          auVar213._0_8_ = 0xbf800000bf800000;
          auVar213._12_4_ = 0xbf800000;
          auVar310 = vblendvps_avx(auVar161,auVar213,auVar310);
          auVar128 = vblendvps_avx(auVar161,auVar213,auVar128);
          auVar162 = vcmpss_avx(auVar128,auVar310,4);
          auVar162 = vpshufd_avx(ZEXT416(auVar162._0_4_ & 1),0x50);
          auVar162 = vpslld_avx(auVar162,0x1f);
          auVar162 = vpsrad_avx(auVar162,0x1f);
          auVar162 = vpandn_avx(auVar162,_DAT_01fafeb0);
          auVar129 = vmovshdup_avx(auVar128);
          fVar223 = auVar129._0_4_;
          if ((auVar128._0_4_ != fVar223) || (NAN(auVar128._0_4_) || NAN(fVar223))) {
            if ((fVar200 != fVar197) || (NAN(fVar200) || NAN(fVar197))) {
              fVar197 = -fVar197 / (fVar200 - fVar197);
              auVar128 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar197) * 0.0 + fVar197)));
            }
            else {
              auVar128 = ZEXT816(0x3f80000000000000);
              if ((fVar197 != 0.0) || (NAN(fVar197))) {
                auVar128 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar258 = vcmpps_avx(auVar162,auVar128,1);
            auVar129 = vblendps_avx(auVar162,auVar128,2);
            auVar128 = vblendps_avx(auVar128,auVar162,2);
            auVar162 = vblendvps_avx(auVar128,auVar129,auVar258);
          }
          auVar90 = vcmpss_avx(auVar90,ZEXT416(0) << 0x20,1);
          auVar163._8_4_ = 0x3f800000;
          auVar163._0_8_ = 0x3f8000003f800000;
          auVar163._12_4_ = 0x3f800000;
          auVar214._8_4_ = 0xbf800000;
          auVar214._0_8_ = 0xbf800000bf800000;
          auVar214._12_4_ = 0xbf800000;
          auVar90 = vblendvps_avx(auVar163,auVar214,auVar90);
          fVar197 = auVar90._0_4_;
          if ((auVar310._0_4_ != fVar197) || (NAN(auVar310._0_4_) || NAN(fVar197))) {
            if ((fVar195 != fVar193) || (NAN(fVar195) || NAN(fVar193))) {
              fVar193 = -fVar193 / (fVar195 - fVar193);
              auVar90 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar193) * 0.0 + fVar193)));
            }
            else {
              auVar90 = ZEXT816(0x3f80000000000000);
              if ((fVar193 != 0.0) || (NAN(fVar193))) {
                auVar90 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar128 = vcmpps_avx(auVar162,auVar90,1);
            auVar310 = vblendps_avx(auVar162,auVar90,2);
            auVar90 = vblendps_avx(auVar90,auVar162,2);
            auVar162 = vblendvps_avx(auVar90,auVar310,auVar128);
          }
          if ((fVar223 != fVar197) || (NAN(fVar223) || NAN(fVar197))) {
            auVar91._8_4_ = 0x3f800000;
            auVar91._0_8_ = 0x3f8000003f800000;
            auVar91._12_4_ = 0x3f800000;
            auVar90 = vcmpps_avx(auVar162,auVar91,1);
            auVar310 = vinsertps_avx(auVar162,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar164._4_12_ = auVar162._4_12_;
            auVar164._0_4_ = 0x3f800000;
            auVar162 = vblendvps_avx(auVar164,auVar310,auVar90);
          }
          auVar90 = vcmpps_avx(auVar162,_DAT_01f7b6f0,1);
          auVar53._12_4_ = 0;
          auVar53._0_12_ = auVar162._4_12_;
          auVar310 = vinsertps_avx(auVar162,ZEXT416(0x3f800000),0x10);
          auVar90 = vblendvps_avx(auVar310,auVar53 << 0x20,auVar90);
          auVar310 = vmovshdup_avx(auVar90);
          if (auVar90._0_4_ <= auVar310._0_4_) {
            auVar92._0_4_ = auVar90._0_4_ + -0.1;
            auVar92._4_4_ = auVar90._4_4_ + 0.1;
            auVar92._8_4_ = auVar90._8_4_ + 0.0;
            auVar92._12_4_ = auVar90._12_4_ + 0.0;
            auVar128 = vshufpd_avx(auVar212,auVar212,3);
            auVar253._8_8_ = 0x3f80000000000000;
            auVar253._0_8_ = 0x3f80000000000000;
            auVar90 = vcmpps_avx(auVar92,auVar253,1);
            auVar51._12_4_ = 0;
            auVar51._0_12_ = auVar92._4_12_;
            auVar310 = vinsertps_avx(auVar92,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar90 = vblendvps_avx(auVar310,auVar51 << 0x20,auVar90);
            auVar310 = vshufpd_avx(auVar72,auVar72,3);
            auVar162 = vshufps_avx(auVar90,auVar90,0x50);
            auVar254._8_4_ = 0x3f800000;
            auVar254._0_8_ = 0x3f8000003f800000;
            auVar254._12_4_ = 0x3f800000;
            auVar129 = vsubps_avx(auVar254,auVar162);
            local_478._0_4_ = auVar176._0_4_;
            local_478._4_4_ = auVar176._4_4_;
            fStack_470 = auVar176._8_4_;
            fStack_46c = auVar176._12_4_;
            fVar193 = auVar162._0_4_;
            fVar195 = auVar162._4_4_;
            fVar197 = auVar162._8_4_;
            fVar200 = auVar162._12_4_;
            local_558 = auVar140._0_4_;
            fStack_554 = auVar140._4_4_;
            fStack_550 = auVar140._8_4_;
            fStack_54c = auVar140._12_4_;
            fVar223 = auVar129._0_4_;
            fVar225 = auVar129._4_4_;
            fVar228 = auVar129._8_4_;
            fVar224 = auVar129._12_4_;
            auVar93._0_4_ = fVar193 * (float)local_478._0_4_ + fVar223 * auVar252._0_4_;
            auVar93._4_4_ = fVar195 * (float)local_478._4_4_ + fVar225 * auVar252._4_4_;
            auVar93._8_4_ = fVar197 * fStack_470 + fVar228 * auVar252._0_4_;
            auVar93._12_4_ = fVar200 * fStack_46c + fVar224 * auVar252._4_4_;
            auVar236._0_4_ = auVar128._0_4_ * fVar193 + fVar223 * auVar212._0_4_;
            auVar236._4_4_ = auVar128._4_4_ * fVar195 + fVar225 * auVar212._4_4_;
            auVar236._8_4_ = auVar128._8_4_ * fVar197 + fVar228 * auVar212._0_4_;
            auVar236._12_4_ = auVar128._12_4_ * fVar200 + fVar224 * auVar212._4_4_;
            auVar267._0_4_ = auVar310._0_4_ * fVar193 + fVar223 * fVar226;
            auVar267._4_4_ = auVar310._4_4_ * fVar195 + fVar225 * fVar229;
            auVar267._8_4_ = auVar310._8_4_ * fVar197 + fVar228 * fVar226;
            auVar267._12_4_ = auVar310._12_4_ * fVar200 + fVar224 * fVar229;
            auVar313._0_4_ = fVar193 * local_558 + fVar223 * auVar257._16_4_;
            auVar313._4_4_ = fVar195 * fStack_554 + fVar225 * auVar257._20_4_;
            auVar313._8_4_ = fVar197 * fStack_550 + fVar228 * auVar257._16_4_;
            auVar313._12_4_ = fVar200 * fStack_54c + fVar224 * auVar257._20_4_;
            auVar140 = vsubps_avx(auVar254,auVar90);
            auVar310 = vmovshdup_avx(auVar346);
            auVar176 = vmovsldup_avx(auVar346);
            auVar255._0_4_ = auVar140._0_4_ * auVar176._0_4_ + auVar90._0_4_ * auVar310._0_4_;
            auVar255._4_4_ = auVar140._4_4_ * auVar176._4_4_ + auVar90._4_4_ * auVar310._4_4_;
            auVar255._8_4_ = auVar140._8_4_ * auVar176._8_4_ + auVar90._8_4_ * auVar310._8_4_;
            auVar255._12_4_ = auVar140._12_4_ * auVar176._12_4_ + auVar90._12_4_ * auVar310._12_4_;
            auVar72 = vmovshdup_avx(auVar255);
            auVar90 = vsubps_avx(auVar236,auVar93);
            auVar165._0_4_ = auVar90._0_4_ * 3.0;
            auVar165._4_4_ = auVar90._4_4_ * 3.0;
            auVar165._8_4_ = auVar90._8_4_ * 3.0;
            auVar165._12_4_ = auVar90._12_4_ * 3.0;
            auVar90 = vsubps_avx(auVar267,auVar236);
            auVar189._0_4_ = auVar90._0_4_ * 3.0;
            auVar189._4_4_ = auVar90._4_4_ * 3.0;
            auVar189._8_4_ = auVar90._8_4_ * 3.0;
            auVar189._12_4_ = auVar90._12_4_ * 3.0;
            auVar90 = vsubps_avx(auVar313,auVar267);
            auVar283._0_4_ = auVar90._0_4_ * 3.0;
            auVar283._4_4_ = auVar90._4_4_ * 3.0;
            auVar283._8_4_ = auVar90._8_4_ * 3.0;
            auVar283._12_4_ = auVar90._12_4_ * 3.0;
            auVar310 = vminps_avx(auVar189,auVar283);
            auVar90 = vmaxps_avx(auVar189,auVar283);
            auVar310 = vminps_avx(auVar165,auVar310);
            auVar90 = vmaxps_avx(auVar165,auVar90);
            auVar176 = vshufpd_avx(auVar310,auVar310,3);
            auVar140 = vshufpd_avx(auVar90,auVar90,3);
            auVar310 = vminps_avx(auVar310,auVar176);
            auVar90 = vmaxps_avx(auVar90,auVar140);
            auVar176 = vshufps_avx(ZEXT416((uint)(1.0 / fVar111)),ZEXT416((uint)(1.0 / fVar111)),0);
            auVar284._0_4_ = auVar176._0_4_ * auVar310._0_4_;
            auVar284._4_4_ = auVar176._4_4_ * auVar310._4_4_;
            auVar284._8_4_ = auVar176._8_4_ * auVar310._8_4_;
            auVar284._12_4_ = auVar176._12_4_ * auVar310._12_4_;
            auVar294._0_4_ = auVar176._0_4_ * auVar90._0_4_;
            auVar294._4_4_ = auVar176._4_4_ * auVar90._4_4_;
            auVar294._8_4_ = auVar176._8_4_ * auVar90._8_4_;
            auVar294._12_4_ = auVar176._12_4_ * auVar90._12_4_;
            auVar129 = ZEXT416((uint)(1.0 / (auVar72._0_4_ - auVar255._0_4_)));
            auVar90 = vshufpd_avx(auVar93,auVar93,3);
            auVar310 = vshufpd_avx(auVar236,auVar236,3);
            auVar176 = vshufpd_avx(auVar267,auVar267,3);
            auVar140 = vshufpd_avx(auVar313,auVar313,3);
            auVar90 = vsubps_avx(auVar90,auVar93);
            auVar128 = vsubps_avx(auVar310,auVar236);
            auVar162 = vsubps_avx(auVar176,auVar267);
            auVar140 = vsubps_avx(auVar140,auVar313);
            auVar310 = vminps_avx(auVar90,auVar128);
            auVar90 = vmaxps_avx(auVar90,auVar128);
            auVar176 = vminps_avx(auVar162,auVar140);
            auVar176 = vminps_avx(auVar310,auVar176);
            auVar310 = vmaxps_avx(auVar162,auVar140);
            auVar90 = vmaxps_avx(auVar90,auVar310);
            auVar310 = vshufps_avx(auVar129,auVar129,0);
            auVar342._0_4_ = auVar310._0_4_ * auVar176._0_4_;
            auVar342._4_4_ = auVar310._4_4_ * auVar176._4_4_;
            auVar342._8_4_ = auVar310._8_4_ * auVar176._8_4_;
            auVar342._12_4_ = auVar310._12_4_ * auVar176._12_4_;
            auVar347._0_4_ = auVar310._0_4_ * auVar90._0_4_;
            auVar347._4_4_ = auVar310._4_4_ * auVar90._4_4_;
            auVar347._8_4_ = auVar310._8_4_ * auVar90._8_4_;
            auVar347._12_4_ = auVar310._12_4_ * auVar90._12_4_;
            auVar90 = vmovsldup_avx(auVar255);
            auVar314._4_12_ = auVar90._4_12_;
            auVar314._0_4_ = fVar179;
            auVar320._4_12_ = auVar255._4_12_;
            auVar320._0_4_ = fVar109;
            auVar190._0_4_ = (fVar179 + fVar109) * 0.5;
            auVar190._4_4_ = (auVar90._4_4_ + auVar255._4_4_) * 0.5;
            auVar190._8_4_ = (auVar90._8_4_ + auVar255._8_4_) * 0.5;
            auVar190._12_4_ = (auVar90._12_4_ + auVar255._12_4_) * 0.5;
            auVar90 = vshufps_avx(auVar190,auVar190,0);
            fVar193 = auVar90._0_4_;
            fVar195 = auVar90._4_4_;
            fVar197 = auVar90._8_4_;
            fVar200 = auVar90._12_4_;
            local_5b8._0_4_ = auVar280._0_4_;
            local_5b8._4_4_ = auVar280._4_4_;
            fStack_5b0 = auVar280._8_4_;
            fStack_5ac = auVar280._12_4_;
            auVar130._0_4_ = fVar193 * (float)local_258._0_4_ + (float)local_5b8._0_4_;
            auVar130._4_4_ = fVar195 * (float)local_258._4_4_ + (float)local_5b8._4_4_;
            auVar130._8_4_ = fVar197 * fStack_250 + fStack_5b0;
            auVar130._12_4_ = fVar200 * fStack_24c + fStack_5ac;
            local_5c8._0_4_ = auVar14._0_4_;
            local_5c8._4_4_ = auVar14._4_4_;
            fStack_5c0 = auVar14._8_4_;
            fStack_5bc = auVar14._12_4_;
            auVar166._0_4_ = fVar193 * (float)local_268._0_4_ + (float)local_5c8._0_4_;
            auVar166._4_4_ = fVar195 * (float)local_268._4_4_ + (float)local_5c8._4_4_;
            auVar166._8_4_ = fVar197 * fStack_260 + fStack_5c0;
            auVar166._12_4_ = fVar200 * fStack_25c + fStack_5bc;
            local_5d8 = auVar156._0_4_;
            fStack_5d4 = auVar156._4_4_;
            fStack_5d0 = auVar156._8_4_;
            fStack_5cc = auVar156._12_4_;
            auVar237._0_4_ = fVar193 * (float)local_278._0_4_ + local_5d8;
            auVar237._4_4_ = fVar195 * (float)local_278._4_4_ + fStack_5d4;
            auVar237._8_4_ = fVar197 * fStack_270 + fStack_5d0;
            auVar237._12_4_ = fVar200 * fStack_26c + fStack_5cc;
            auVar90 = vsubps_avx(auVar166,auVar130);
            auVar131._0_4_ = auVar130._0_4_ + fVar193 * auVar90._0_4_;
            auVar131._4_4_ = auVar130._4_4_ + fVar195 * auVar90._4_4_;
            auVar131._8_4_ = auVar130._8_4_ + fVar197 * auVar90._8_4_;
            auVar131._12_4_ = auVar130._12_4_ + fVar200 * auVar90._12_4_;
            auVar90 = vsubps_avx(auVar237,auVar166);
            auVar167._0_4_ = auVar166._0_4_ + fVar193 * auVar90._0_4_;
            auVar167._4_4_ = auVar166._4_4_ + fVar195 * auVar90._4_4_;
            auVar167._8_4_ = auVar166._8_4_ + fVar197 * auVar90._8_4_;
            auVar167._12_4_ = auVar166._12_4_ + fVar200 * auVar90._12_4_;
            auVar90 = vsubps_avx(auVar167,auVar131);
            fVar193 = auVar131._0_4_ + fVar193 * auVar90._0_4_;
            fVar195 = auVar131._4_4_ + fVar195 * auVar90._4_4_;
            auVar94._0_8_ = CONCAT44(fVar195,fVar193);
            auVar94._8_4_ = auVar131._8_4_ + fVar197 * auVar90._8_4_;
            auVar94._12_4_ = auVar131._12_4_ + fVar200 * auVar90._12_4_;
            fVar197 = auVar90._0_4_ * 3.0;
            fVar200 = auVar90._4_4_ * 3.0;
            auVar132._0_8_ = CONCAT44(fVar200,fVar197);
            auVar132._8_4_ = auVar90._8_4_ * 3.0;
            auVar132._12_4_ = auVar90._12_4_ * 3.0;
            auVar168._8_8_ = auVar94._0_8_;
            auVar168._0_8_ = auVar94._0_8_;
            auVar90 = vshufpd_avx(auVar94,auVar94,3);
            auVar310 = vshufps_avx(auVar190,auVar190,0x55);
            auVar162 = vsubps_avx(auVar90,auVar168);
            auVar330._0_4_ = auVar162._0_4_ * auVar310._0_4_ + fVar193;
            auVar330._4_4_ = auVar162._4_4_ * auVar310._4_4_ + fVar195;
            auVar330._8_4_ = auVar162._8_4_ * auVar310._8_4_ + fVar193;
            auVar330._12_4_ = auVar162._12_4_ * auVar310._12_4_ + fVar195;
            auVar169._8_8_ = auVar132._0_8_;
            auVar169._0_8_ = auVar132._0_8_;
            auVar90 = vshufpd_avx(auVar132,auVar132,1);
            auVar90 = vsubps_avx(auVar90,auVar169);
            auVar133._0_4_ = auVar90._0_4_ * auVar310._0_4_ + fVar197;
            auVar133._4_4_ = auVar90._4_4_ * auVar310._4_4_ + fVar200;
            auVar133._8_4_ = auVar90._8_4_ * auVar310._8_4_ + fVar197;
            auVar133._12_4_ = auVar90._12_4_ * auVar310._12_4_ + fVar200;
            auVar310 = vmovshdup_avx(auVar133);
            auVar238._0_8_ = auVar310._0_8_ ^ 0x8000000080000000;
            auVar238._8_4_ = auVar310._8_4_ ^ 0x80000000;
            auVar238._12_4_ = auVar310._12_4_ ^ 0x80000000;
            auVar176 = vmovshdup_avx(auVar162);
            auVar90 = vunpcklps_avx(auVar176,auVar238);
            auVar140 = vshufps_avx(auVar90,auVar238,4);
            auVar95._0_8_ = auVar162._0_8_ ^ 0x8000000080000000;
            auVar95._8_4_ = -auVar162._8_4_;
            auVar95._12_4_ = -auVar162._12_4_;
            auVar90 = vmovlhps_avx(auVar95,auVar133);
            auVar128 = vshufps_avx(auVar90,auVar133,8);
            auVar90 = ZEXT416((uint)(auVar133._0_4_ * auVar176._0_4_ -
                                    auVar162._0_4_ * auVar310._0_4_));
            auVar310 = vshufps_avx(auVar90,auVar90,0);
            auVar90 = vdivps_avx(auVar140,auVar310);
            auVar310 = vdivps_avx(auVar128,auVar310);
            auVar128 = vinsertps_avx(auVar284,auVar342,0x1c);
            auVar162 = vinsertps_avx(auVar294,auVar347,0x1c);
            auVar129 = vinsertps_avx(auVar342,auVar284,0x4c);
            auVar258 = vinsertps_avx(auVar347,auVar294,0x4c);
            auVar176 = vmovsldup_avx(auVar90);
            auVar170._0_4_ = auVar176._0_4_ * auVar128._0_4_;
            auVar170._4_4_ = auVar176._4_4_ * auVar128._4_4_;
            auVar170._8_4_ = auVar176._8_4_ * auVar128._8_4_;
            auVar170._12_4_ = auVar176._12_4_ * auVar128._12_4_;
            auVar134._0_4_ = auVar162._0_4_ * auVar176._0_4_;
            auVar134._4_4_ = auVar162._4_4_ * auVar176._4_4_;
            auVar134._8_4_ = auVar162._8_4_ * auVar176._8_4_;
            auVar134._12_4_ = auVar162._12_4_ * auVar176._12_4_;
            auVar140 = vminps_avx(auVar170,auVar134);
            auVar176 = vmaxps_avx(auVar134,auVar170);
            auVar71 = vmovsldup_avx(auVar310);
            auVar348._0_4_ = auVar129._0_4_ * auVar71._0_4_;
            auVar348._4_4_ = auVar129._4_4_ * auVar71._4_4_;
            auVar348._8_4_ = auVar129._8_4_ * auVar71._8_4_;
            auVar348._12_4_ = auVar129._12_4_ * auVar71._12_4_;
            auVar171._0_4_ = auVar258._0_4_ * auVar71._0_4_;
            auVar171._4_4_ = auVar258._4_4_ * auVar71._4_4_;
            auVar171._8_4_ = auVar258._8_4_ * auVar71._8_4_;
            auVar171._12_4_ = auVar258._12_4_ * auVar71._12_4_;
            auVar71 = vminps_avx(auVar348,auVar171);
            auVar215._0_4_ = auVar140._0_4_ + auVar71._0_4_;
            auVar215._4_4_ = auVar140._4_4_ + auVar71._4_4_;
            auVar215._8_4_ = auVar140._8_4_ + auVar71._8_4_;
            auVar215._12_4_ = auVar140._12_4_ + auVar71._12_4_;
            auVar140 = vmaxps_avx(auVar171,auVar348);
            auVar71 = vsubps_avx(auVar314,auVar190);
            auVar73 = vsubps_avx(auVar320,auVar190);
            auVar135._0_4_ = auVar176._0_4_ + auVar140._0_4_;
            auVar135._4_4_ = auVar176._4_4_ + auVar140._4_4_;
            auVar135._8_4_ = auVar176._8_4_ + auVar140._8_4_;
            auVar135._12_4_ = auVar176._12_4_ + auVar140._12_4_;
            auVar172._8_8_ = 0x3f800000;
            auVar172._0_8_ = 0x3f800000;
            auVar176 = vsubps_avx(auVar172,auVar135);
            auVar140 = vsubps_avx(auVar172,auVar215);
            fVar228 = auVar71._0_4_;
            auVar216._0_4_ = fVar228 * auVar176._0_4_;
            fVar224 = auVar71._4_4_;
            auVar216._4_4_ = fVar224 * auVar176._4_4_;
            fVar226 = auVar71._8_4_;
            auVar216._8_4_ = fVar226 * auVar176._8_4_;
            fVar229 = auVar71._12_4_;
            auVar216._12_4_ = fVar229 * auVar176._12_4_;
            fVar197 = auVar73._0_4_;
            auVar136._0_4_ = fVar197 * auVar176._0_4_;
            fVar200 = auVar73._4_4_;
            auVar136._4_4_ = fVar200 * auVar176._4_4_;
            fVar223 = auVar73._8_4_;
            auVar136._8_4_ = fVar223 * auVar176._8_4_;
            fVar225 = auVar73._12_4_;
            auVar136._12_4_ = fVar225 * auVar176._12_4_;
            auVar321._0_4_ = fVar228 * auVar140._0_4_;
            auVar321._4_4_ = fVar224 * auVar140._4_4_;
            auVar321._8_4_ = fVar226 * auVar140._8_4_;
            auVar321._12_4_ = fVar229 * auVar140._12_4_;
            auVar173._0_4_ = fVar197 * auVar140._0_4_;
            auVar173._4_4_ = fVar200 * auVar140._4_4_;
            auVar173._8_4_ = fVar223 * auVar140._8_4_;
            auVar173._12_4_ = fVar225 * auVar140._12_4_;
            auVar176 = vminps_avx(auVar216,auVar321);
            auVar140 = vminps_avx(auVar136,auVar173);
            auVar71 = vminps_avx(auVar176,auVar140);
            auVar176 = vmaxps_avx(auVar321,auVar216);
            auVar140 = vmaxps_avx(auVar173,auVar136);
            auVar73 = vshufps_avx(auVar190,auVar190,0x54);
            auVar140 = vmaxps_avx(auVar140,auVar176);
            auVar115 = vshufps_avx(auVar330,auVar330,0);
            auVar116 = vshufps_avx(auVar330,auVar330,0x55);
            auVar176 = vhaddps_avx(auVar71,auVar71);
            auVar140 = vhaddps_avx(auVar140,auVar140);
            auVar191._0_4_ = auVar115._0_4_ * auVar90._0_4_ + auVar116._0_4_ * auVar310._0_4_;
            auVar191._4_4_ = auVar115._4_4_ * auVar90._4_4_ + auVar116._4_4_ * auVar310._4_4_;
            auVar191._8_4_ = auVar115._8_4_ * auVar90._8_4_ + auVar116._8_4_ * auVar310._8_4_;
            auVar191._12_4_ = auVar115._12_4_ * auVar90._12_4_ + auVar116._12_4_ * auVar310._12_4_;
            auVar71 = vsubps_avx(auVar73,auVar191);
            fVar193 = auVar71._0_4_ + auVar176._0_4_;
            fVar195 = auVar71._0_4_ + auVar140._0_4_;
            auVar176 = vmaxss_avx(ZEXT416((uint)fVar179),ZEXT416((uint)fVar193));
            auVar140 = vminss_avx(ZEXT416((uint)fVar195),ZEXT416((uint)fVar109));
            if (auVar176._0_4_ <= auVar140._0_4_) {
              auVar176 = vmovshdup_avx(auVar90);
              auVar96._0_4_ = auVar176._0_4_ * auVar128._0_4_;
              auVar96._4_4_ = auVar176._4_4_ * auVar128._4_4_;
              auVar96._8_4_ = auVar176._8_4_ * auVar128._8_4_;
              auVar96._12_4_ = auVar176._12_4_ * auVar128._12_4_;
              auVar137._0_4_ = auVar162._0_4_ * auVar176._0_4_;
              auVar137._4_4_ = auVar162._4_4_ * auVar176._4_4_;
              auVar137._8_4_ = auVar162._8_4_ * auVar176._8_4_;
              auVar137._12_4_ = auVar162._12_4_ * auVar176._12_4_;
              auVar140 = vminps_avx(auVar96,auVar137);
              auVar176 = vmaxps_avx(auVar137,auVar96);
              auVar128 = vmovshdup_avx(auVar310);
              auVar217._0_4_ = auVar129._0_4_ * auVar128._0_4_;
              auVar217._4_4_ = auVar129._4_4_ * auVar128._4_4_;
              auVar217._8_4_ = auVar129._8_4_ * auVar128._8_4_;
              auVar217._12_4_ = auVar129._12_4_ * auVar128._12_4_;
              auVar138._0_4_ = auVar258._0_4_ * auVar128._0_4_;
              auVar138._4_4_ = auVar258._4_4_ * auVar128._4_4_;
              auVar138._8_4_ = auVar258._8_4_ * auVar128._8_4_;
              auVar138._12_4_ = auVar258._12_4_ * auVar128._12_4_;
              auVar128 = vminps_avx(auVar217,auVar138);
              auVar174._0_4_ = auVar140._0_4_ + auVar128._0_4_;
              auVar174._4_4_ = auVar140._4_4_ + auVar128._4_4_;
              auVar174._8_4_ = auVar140._8_4_ + auVar128._8_4_;
              auVar174._12_4_ = auVar140._12_4_ + auVar128._12_4_;
              auVar140 = vmaxps_avx(auVar138,auVar217);
              auVar97._0_4_ = auVar176._0_4_ + auVar140._0_4_;
              auVar97._4_4_ = auVar176._4_4_ + auVar140._4_4_;
              auVar97._8_4_ = auVar176._8_4_ + auVar140._8_4_;
              auVar97._12_4_ = auVar176._12_4_ + auVar140._12_4_;
              auVar176 = vsubps_avx(auVar253,auVar97);
              auVar140 = vsubps_avx(auVar253,auVar174);
              auVar175._0_4_ = fVar228 * auVar176._0_4_;
              auVar175._4_4_ = fVar224 * auVar176._4_4_;
              auVar175._8_4_ = fVar226 * auVar176._8_4_;
              auVar175._12_4_ = fVar229 * auVar176._12_4_;
              auVar218._0_4_ = fVar228 * auVar140._0_4_;
              auVar218._4_4_ = fVar224 * auVar140._4_4_;
              auVar218._8_4_ = fVar226 * auVar140._8_4_;
              auVar218._12_4_ = fVar229 * auVar140._12_4_;
              auVar98._0_4_ = fVar197 * auVar176._0_4_;
              auVar98._4_4_ = fVar200 * auVar176._4_4_;
              auVar98._8_4_ = fVar223 * auVar176._8_4_;
              auVar98._12_4_ = fVar225 * auVar176._12_4_;
              auVar139._0_4_ = fVar197 * auVar140._0_4_;
              auVar139._4_4_ = fVar200 * auVar140._4_4_;
              auVar139._8_4_ = fVar223 * auVar140._8_4_;
              auVar139._12_4_ = fVar225 * auVar140._12_4_;
              auVar176 = vminps_avx(auVar175,auVar218);
              auVar140 = vminps_avx(auVar98,auVar139);
              auVar176 = vminps_avx(auVar176,auVar140);
              auVar140 = vmaxps_avx(auVar218,auVar175);
              auVar128 = vmaxps_avx(auVar139,auVar98);
              auVar176 = vhaddps_avx(auVar176,auVar176);
              auVar140 = vmaxps_avx(auVar128,auVar140);
              auVar140 = vhaddps_avx(auVar140,auVar140);
              auVar128 = vmovshdup_avx(auVar71);
              auVar162 = ZEXT416((uint)(auVar128._0_4_ + auVar176._0_4_));
              auVar176 = vmaxss_avx(auVar255,auVar162);
              auVar128 = ZEXT416((uint)(auVar128._0_4_ + auVar140._0_4_));
              auVar140 = vminss_avx(auVar128,auVar72);
              if (auVar176._0_4_ <= auVar140._0_4_) {
                bVar66 = 0;
                if ((fVar179 < fVar193) && (fVar195 < fVar109)) {
                  auVar176 = vcmpps_avx(auVar128,auVar72,1);
                  auVar140 = vcmpps_avx(auVar255,auVar162,1);
                  auVar176 = vandps_avx(auVar140,auVar176);
                  bVar66 = auVar176[0];
                }
                auVar350 = ZEXT1664(auVar255);
                if ((uVar69 < 4 && 0.001 <= fVar111) && (bVar66 & 1) == 0) goto LAB_00fb889a;
                lVar64 = 200;
                do {
                  fVar111 = auVar71._0_4_;
                  fVar109 = 1.0 - fVar111;
                  auVar176 = ZEXT416((uint)(fVar109 * fVar109 * fVar109));
                  auVar176 = vshufps_avx(auVar176,auVar176,0);
                  auVar140 = ZEXT416((uint)(fVar111 * 3.0 * fVar109 * fVar109));
                  auVar140 = vshufps_avx(auVar140,auVar140,0);
                  auVar128 = ZEXT416((uint)(fVar109 * fVar111 * fVar111 * 3.0));
                  auVar128 = vshufps_avx(auVar128,auVar128,0);
                  auVar162 = ZEXT416((uint)(fVar111 * fVar111 * fVar111));
                  auVar162 = vshufps_avx(auVar162,auVar162,0);
                  local_538._0_4_ = auVar209._0_4_;
                  local_538._4_4_ = auVar209._4_4_;
                  fStack_530 = auVar209._8_4_;
                  fStack_52c = auVar209._12_4_;
                  fVar109 = auVar176._0_4_ * (float)local_5b8._0_4_ +
                            auVar140._0_4_ * (float)local_5c8._0_4_ +
                            auVar162._0_4_ * (float)local_538._0_4_ + auVar128._0_4_ * local_5d8;
                  fVar111 = auVar176._4_4_ * (float)local_5b8._4_4_ +
                            auVar140._4_4_ * (float)local_5c8._4_4_ +
                            auVar162._4_4_ * (float)local_538._4_4_ + auVar128._4_4_ * fStack_5d4;
                  auVar99._0_8_ = CONCAT44(fVar111,fVar109);
                  auVar99._8_4_ =
                       auVar176._8_4_ * fStack_5b0 +
                       auVar140._8_4_ * fStack_5c0 +
                       auVar162._8_4_ * fStack_530 + auVar128._8_4_ * fStack_5d0;
                  auVar99._12_4_ =
                       auVar176._12_4_ * fStack_5ac +
                       auVar140._12_4_ * fStack_5bc +
                       auVar162._12_4_ * fStack_52c + auVar128._12_4_ * fStack_5cc;
                  auVar141._8_8_ = auVar99._0_8_;
                  auVar141._0_8_ = auVar99._0_8_;
                  auVar140 = vshufpd_avx(auVar99,auVar99,1);
                  auVar176 = vmovshdup_avx(auVar71);
                  auVar140 = vsubps_avx(auVar140,auVar141);
                  auVar100._0_4_ = auVar176._0_4_ * auVar140._0_4_ + fVar109;
                  auVar100._4_4_ = auVar176._4_4_ * auVar140._4_4_ + fVar111;
                  auVar100._8_4_ = auVar176._8_4_ * auVar140._8_4_ + fVar109;
                  auVar100._12_4_ = auVar176._12_4_ * auVar140._12_4_ + fVar111;
                  auVar176 = vshufps_avx(auVar100,auVar100,0);
                  auVar140 = vshufps_avx(auVar100,auVar100,0x55);
                  auVar142._0_4_ = auVar90._0_4_ * auVar176._0_4_ + auVar310._0_4_ * auVar140._0_4_;
                  auVar142._4_4_ = auVar90._4_4_ * auVar176._4_4_ + auVar310._4_4_ * auVar140._4_4_;
                  auVar142._8_4_ = auVar90._8_4_ * auVar176._8_4_ + auVar310._8_4_ * auVar140._8_4_;
                  auVar142._12_4_ =
                       auVar90._12_4_ * auVar176._12_4_ + auVar310._12_4_ * auVar140._12_4_;
                  auVar71 = vsubps_avx(auVar71,auVar142);
                  auVar143._8_4_ = 0x7fffffff;
                  auVar143._0_8_ = 0x7fffffff7fffffff;
                  auVar143._12_4_ = 0x7fffffff;
                  auVar176 = vandps_avx(auVar100,auVar143);
                  auVar140 = vshufps_avx(auVar176,auVar176,0xf5);
                  auVar176 = vmaxss_avx(auVar140,auVar176);
                  if (auVar176._0_4_ < fVar70) {
                    fVar109 = auVar71._0_4_;
                    if ((0.0 <= fVar109) && (fVar109 <= 1.0)) {
                      auVar90 = vmovshdup_avx(auVar71);
                      fVar111 = auVar90._0_4_;
                      if ((0.0 <= fVar111) && (fVar111 <= 1.0)) {
                        auVar90 = vinsertps_avx(ZEXT416((uint)(pLVar60->vx).field_0.m128[2]),
                                                ZEXT416((uint)(pLVar60->vy).field_0.m128[2]),0x1c);
                        auVar258 = vinsertps_avx(auVar90,ZEXT416((uint)(pLVar60->vz).field_0.m128[2]
                                                                ),0x28);
                        auVar90 = vdpps_avx(auVar258,local_288,0x7f);
                        auVar310 = vdpps_avx(auVar258,local_298,0x7f);
                        auVar176 = vdpps_avx(auVar258,local_2a8,0x7f);
                        auVar140 = vdpps_avx(auVar258,local_2b8,0x7f);
                        auVar128 = vdpps_avx(auVar258,local_2c8,0x7f);
                        auVar162 = vdpps_avx(auVar258,local_2d8,0x7f);
                        auVar129 = vdpps_avx(auVar258,local_2e8,0x7f);
                        auVar258 = vdpps_avx(auVar258,local_2f8,0x7f);
                        fVar200 = 1.0 - fVar111;
                        fVar223 = 1.0 - fVar109;
                        fVar179 = auVar71._4_4_;
                        fVar193 = auVar71._8_4_;
                        fVar195 = auVar71._12_4_;
                        fVar197 = fVar223 * fVar109 * fVar109 * 3.0;
                        auVar268._0_4_ = fVar109 * fVar109 * fVar109;
                        auVar268._4_4_ = fVar179 * fVar179 * fVar179;
                        auVar268._8_4_ = fVar193 * fVar193 * fVar193;
                        auVar268._12_4_ = fVar195 * fVar195 * fVar195;
                        fVar193 = fVar223 * fVar223 * fVar109 * 3.0;
                        fVar195 = fVar223 * fVar223 * fVar223;
                        fVar179 = fVar195 * (fVar200 * auVar90._0_4_ + fVar111 * auVar128._0_4_) +
                                  (fVar200 * auVar310._0_4_ + auVar162._0_4_ * fVar111) * fVar193 +
                                  fVar197 * (auVar129._0_4_ * fVar111 + fVar200 * auVar176._0_4_) +
                                  auVar268._0_4_ *
                                  (fVar200 * auVar140._0_4_ + fVar111 * auVar258._0_4_);
                        auVar90 = ZEXT416((uint)fVar179);
                        if (((fVar114 <= fVar179) &&
                            (fVar200 = *(float *)(ray + k * 4 + 0x80), fVar179 <= fVar200)) &&
                           (pGVar8 = (context->scene->geometries).items[uVar62].ptr,
                           (pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
                          local_1c8 = vshufps_avx(auVar71,auVar71,0x55);
                          auVar295._8_4_ = 0x3f800000;
                          auVar295._0_8_ = 0x3f8000003f800000;
                          auVar295._12_4_ = 0x3f800000;
                          auVar310 = vsubps_avx(auVar295,local_1c8);
                          fVar225 = local_1c8._0_4_;
                          fVar228 = local_1c8._4_4_;
                          fVar224 = local_1c8._8_4_;
                          fVar226 = local_1c8._12_4_;
                          fVar229 = auVar310._0_4_;
                          fVar112 = auVar310._4_4_;
                          fVar113 = auVar310._8_4_;
                          fVar199 = auVar310._12_4_;
                          auVar315._0_4_ =
                               fVar225 * (float)local_3b8._0_4_ + fVar229 * (float)local_398._0_4_;
                          auVar315._4_4_ =
                               fVar228 * (float)local_3b8._4_4_ + fVar112 * (float)local_398._4_4_;
                          auVar315._8_4_ = fVar224 * fStack_3b0 + fVar113 * fStack_390;
                          auVar315._12_4_ = fVar226 * fStack_3ac + fVar199 * fStack_38c;
                          auVar322._0_4_ = fVar225 * (float)local_3c8._0_4_ + fVar229 * fVar230;
                          auVar322._4_4_ = fVar228 * (float)local_3c8._4_4_ + fVar112 * fVar244;
                          auVar322._8_4_ = fVar224 * fStack_3c0 + fVar113 * fVar194;
                          auVar322._12_4_ = fVar226 * fStack_3bc + fVar199 * fVar198;
                          auVar331._0_4_ = fVar225 * local_3d8 + fVar229 * (float)local_3a8._0_4_;
                          auVar331._4_4_ = fVar228 * fStack_3d4 + fVar112 * (float)local_3a8._4_4_;
                          auVar331._8_4_ = fVar224 * fStack_3d0 + fVar113 * fStack_3a0;
                          auVar331._12_4_ = fVar226 * fStack_3cc + fVar199 * fStack_39c;
                          auVar296._0_4_ = fVar225 * (float)local_3e8._0_4_ + fVar229 * fVar242;
                          auVar296._4_4_ = fVar228 * (float)local_3e8._4_4_ + fVar112 * fVar110;
                          auVar296._8_4_ = fVar224 * fStack_3e0 + fVar113 * fVar196;
                          auVar296._12_4_ = fVar226 * fStack_3dc + fVar199 * fVar201;
                          auVar128 = vsubps_avx(auVar322,auVar315);
                          auVar162 = vsubps_avx(auVar331,auVar322);
                          auVar129 = vsubps_avx(auVar296,auVar331);
                          local_1d8 = vshufps_avx(auVar71,auVar71,0);
                          fVar226 = local_1d8._0_4_;
                          fVar229 = local_1d8._4_4_;
                          fVar112 = local_1d8._8_4_;
                          fVar113 = local_1d8._12_4_;
                          auVar310 = vshufps_avx(ZEXT416((uint)fVar223),ZEXT416((uint)fVar223),0);
                          fVar223 = auVar310._0_4_;
                          fVar225 = auVar310._4_4_;
                          fVar228 = auVar310._8_4_;
                          fVar224 = auVar310._12_4_;
                          auVar310 = vshufps_avx(auVar268,auVar268,0);
                          auVar176 = vshufps_avx(ZEXT416((uint)fVar197),ZEXT416((uint)fVar197),0);
                          auVar140 = vshufps_avx(ZEXT416((uint)fVar193),ZEXT416((uint)fVar193),0);
                          auVar256._0_4_ =
                               (fVar223 * (fVar223 * auVar128._0_4_ + fVar226 * auVar162._0_4_) +
                               fVar226 * (fVar223 * auVar162._0_4_ + fVar226 * auVar129._0_4_)) *
                               3.0;
                          auVar256._4_4_ =
                               (fVar225 * (fVar225 * auVar128._4_4_ + fVar229 * auVar162._4_4_) +
                               fVar229 * (fVar225 * auVar162._4_4_ + fVar229 * auVar129._4_4_)) *
                               3.0;
                          auVar256._8_4_ =
                               (fVar228 * (fVar228 * auVar128._8_4_ + fVar112 * auVar162._8_4_) +
                               fVar112 * (fVar228 * auVar162._8_4_ + fVar112 * auVar129._8_4_)) *
                               3.0;
                          auVar256._12_4_ =
                               (fVar224 * (fVar224 * auVar128._12_4_ + fVar113 * auVar162._12_4_) +
                               fVar113 * (fVar224 * auVar162._12_4_ + fVar113 * auVar129._12_4_)) *
                               3.0;
                          auVar128 = vshufps_avx(ZEXT416((uint)fVar195),ZEXT416((uint)fVar195),0);
                          auVar219._0_4_ =
                               auVar128._0_4_ * (float)local_318._0_4_ +
                               auVar140._0_4_ * (float)local_328._0_4_ +
                               auVar310._0_4_ * (float)local_348._0_4_ +
                               auVar176._0_4_ * (float)local_338._0_4_;
                          auVar219._4_4_ =
                               auVar128._4_4_ * (float)local_318._4_4_ +
                               auVar140._4_4_ * (float)local_328._4_4_ +
                               auVar310._4_4_ * (float)local_348._4_4_ +
                               auVar176._4_4_ * (float)local_338._4_4_;
                          auVar219._8_4_ =
                               auVar128._8_4_ * fStack_310 +
                               auVar140._8_4_ * fStack_320 +
                               auVar310._8_4_ * fStack_340 + auVar176._8_4_ * fStack_330;
                          auVar219._12_4_ =
                               auVar128._12_4_ * fStack_30c +
                               auVar140._12_4_ * fStack_31c +
                               auVar310._12_4_ * fStack_33c + auVar176._12_4_ * fStack_32c;
                          auVar310 = vshufps_avx(auVar256,auVar256,0xc9);
                          auVar239._0_4_ = auVar219._0_4_ * auVar310._0_4_;
                          auVar239._4_4_ = auVar219._4_4_ * auVar310._4_4_;
                          auVar239._8_4_ = auVar219._8_4_ * auVar310._8_4_;
                          auVar239._12_4_ = auVar219._12_4_ * auVar310._12_4_;
                          auVar310 = vshufps_avx(auVar219,auVar219,0xc9);
                          auVar220._0_4_ = auVar256._0_4_ * auVar310._0_4_;
                          auVar220._4_4_ = auVar256._4_4_ * auVar310._4_4_;
                          auVar220._8_4_ = auVar256._8_4_ * auVar310._8_4_;
                          auVar220._12_4_ = auVar256._12_4_ * auVar310._12_4_;
                          auVar310 = vsubps_avx(auVar220,auVar239);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x80) = fVar179;
                            uVar4 = vextractps_avx(auVar310,1);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar4;
                            uVar4 = vextractps_avx(auVar310,2);
                            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar4;
                            *(int *)(ray + k * 4 + 0xe0) = auVar310._0_4_;
                            *(float *)(ray + k * 4 + 0xf0) = fVar109;
                            *(float *)(ray + k * 4 + 0x100) = fVar111;
                            *(uint *)(ray + k * 4 + 0x110) = uVar7;
                            *(uint *)(ray + k * 4 + 0x120) = uVar62;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          }
                          else {
                            auVar176 = vshufps_avx(auVar310,auVar310,0x55);
                            auVar140 = vshufps_avx(auVar310,auVar310,0xaa);
                            local_1e8 = vshufps_avx(auVar310,auVar310,0);
                            local_208[0] = (RTCHitN)auVar176[0];
                            local_208[1] = (RTCHitN)auVar176[1];
                            local_208[2] = (RTCHitN)auVar176[2];
                            local_208[3] = (RTCHitN)auVar176[3];
                            local_208[4] = (RTCHitN)auVar176[4];
                            local_208[5] = (RTCHitN)auVar176[5];
                            local_208[6] = (RTCHitN)auVar176[6];
                            local_208[7] = (RTCHitN)auVar176[7];
                            local_208[8] = (RTCHitN)auVar176[8];
                            local_208[9] = (RTCHitN)auVar176[9];
                            local_208[10] = (RTCHitN)auVar176[10];
                            local_208[0xb] = (RTCHitN)auVar176[0xb];
                            local_208[0xc] = (RTCHitN)auVar176[0xc];
                            local_208[0xd] = (RTCHitN)auVar176[0xd];
                            local_208[0xe] = (RTCHitN)auVar176[0xe];
                            local_208[0xf] = (RTCHitN)auVar176[0xf];
                            local_1f8 = auVar140;
                            local_1b8 = local_378._0_8_;
                            uStack_1b0 = local_378._8_8_;
                            local_1a8 = local_368._0_8_;
                            uStack_1a0 = local_368._8_8_;
                            vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                            uStack_194 = context->user->instID[0];
                            local_198 = uStack_194;
                            uStack_190 = uStack_194;
                            uStack_18c = uStack_194;
                            uStack_188 = context->user->instPrimID[0];
                            uStack_184 = uStack_188;
                            uStack_180 = uStack_188;
                            uStack_17c = uStack_188;
                            *(float *)(ray + k * 4 + 0x80) = fVar179;
                            local_448 = *local_430;
                            local_418.valid = (int *)local_448;
                            local_418.geometryUserPtr = pGVar8->userPtr;
                            local_418.context = context->user;
                            local_418.hit = local_208;
                            local_418.N = 4;
                            local_418.ray = (RTCRayN *)ray;
                            if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar8->intersectionFilterN)(&local_418);
                              auVar350._8_56_ = extraout_var;
                              auVar350._0_8_ = extraout_XMM1_Qa;
                              auVar90 = auVar350._0_16_;
                            }
                            if (local_448 == (undefined1  [16])0x0) {
                              auVar310 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar90 = vpcmpeqd_avx(auVar90,auVar90);
                              auVar310 = auVar310 ^ auVar90;
                            }
                            else {
                              p_Var13 = context->args->filter;
                              auVar90 = vpcmpeqd_avx(auVar140,auVar140);
                              if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var13)(&local_418);
                                auVar90 = vpcmpeqd_avx(auVar90,auVar90);
                              }
                              auVar176 = vpcmpeqd_avx(local_448,_DAT_01f7aa10);
                              auVar310 = auVar176 ^ auVar90;
                              if (local_448 != (undefined1  [16])0x0) {
                                auVar176 = auVar176 ^ auVar90;
                                auVar90 = vmaskmovps_avx(auVar176,*(undefined1 (*) [16])
                                                                   local_418.hit);
                                *(undefined1 (*) [16])(local_418.ray + 0xc0) = auVar90;
                                auVar90 = vmaskmovps_avx(auVar176,*(undefined1 (*) [16])
                                                                   (local_418.hit + 0x10));
                                *(undefined1 (*) [16])(local_418.ray + 0xd0) = auVar90;
                                auVar90 = vmaskmovps_avx(auVar176,*(undefined1 (*) [16])
                                                                   (local_418.hit + 0x20));
                                *(undefined1 (*) [16])(local_418.ray + 0xe0) = auVar90;
                                auVar90 = vmaskmovps_avx(auVar176,*(undefined1 (*) [16])
                                                                   (local_418.hit + 0x30));
                                *(undefined1 (*) [16])(local_418.ray + 0xf0) = auVar90;
                                auVar90 = vmaskmovps_avx(auVar176,*(undefined1 (*) [16])
                                                                   (local_418.hit + 0x40));
                                *(undefined1 (*) [16])(local_418.ray + 0x100) = auVar90;
                                auVar90 = vmaskmovps_avx(auVar176,*(undefined1 (*) [16])
                                                                   (local_418.hit + 0x50));
                                *(undefined1 (*) [16])(local_418.ray + 0x110) = auVar90;
                                auVar90 = vmaskmovps_avx(auVar176,*(undefined1 (*) [16])
                                                                   (local_418.hit + 0x60));
                                *(undefined1 (*) [16])(local_418.ray + 0x120) = auVar90;
                                auVar90 = vmaskmovps_avx(auVar176,*(undefined1 (*) [16])
                                                                   (local_418.hit + 0x70));
                                *(undefined1 (*) [16])(local_418.ray + 0x130) = auVar90;
                                auVar90 = vmaskmovps_avx(auVar176,*(undefined1 (*) [16])
                                                                   (local_418.hit + 0x80));
                                *(undefined1 (*) [16])(local_418.ray + 0x140) = auVar90;
                              }
                            }
                            auVar101._8_8_ = 0x100000001;
                            auVar101._0_8_ = 0x100000001;
                            if ((auVar101 & auVar310) == (undefined1  [16])0x0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar200;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                  lVar64 = lVar64 + -1;
                } while (lVar64 != 0);
              }
            }
          }
        }
        if (uVar69 == 0) break;
      } while( true );
    }
    uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar102._4_4_ = uVar4;
    auVar102._0_4_ = uVar4;
    auVar102._8_4_ = uVar4;
    auVar102._12_4_ = uVar4;
    auVar90 = vcmpps_avx(local_358,auVar102,2);
    uVar62 = vmovmskps_avx(auVar90);
    uVar61 = uVar61 & uVar61 + 0xf & uVar62;
    auVar52 = ZEXT812(0) << 0x20;
    if (uVar61 == 0) {
      return;
    }
  } while( true );
LAB_00fb889a:
  auVar90 = vinsertps_avx(ZEXT416((uint)fVar179),ZEXT416((uint)fVar109),0x10);
  auVar354 = ZEXT1664(auVar90);
  goto LAB_00fb7111;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }